

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  uint uVar77;
  ulong uVar78;
  long lVar79;
  uint uVar80;
  ulong uVar81;
  byte unaff_BL;
  uint uVar82;
  long lVar83;
  uint uVar84;
  ulong uVar85;
  vint4 bi_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar100 [32];
  float fVar113;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar151;
  float fVar152;
  vint4 bi_2;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar154;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar192;
  float fVar194;
  vint4 bi;
  undefined1 auVar178 [16];
  float fVar196;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [28];
  float fVar193;
  float fVar195;
  float fVar197;
  float fVar200;
  float fVar201;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar198;
  float fVar199;
  undefined1 auVar191 [64];
  float fVar202;
  float fVar203;
  float fVar222;
  float fVar224;
  vint4 ai_2;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar226;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [28];
  float fVar223;
  float fVar225;
  float fVar227;
  float fVar230;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar220 [32];
  float fVar228;
  float fVar229;
  undefined1 auVar221 [64];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar250;
  float fVar253;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar251;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar261;
  float fVar262;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar252;
  float fVar255;
  float fVar258;
  float fVar260;
  float fVar263;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar277;
  float fVar281;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar285;
  undefined1 auVar270 [32];
  float fVar278;
  float fVar279;
  float fVar282;
  float fVar283;
  float fVar286;
  float fVar287;
  float fVar290;
  float fVar291;
  float fVar294;
  float fVar295;
  float fVar298;
  float fVar299;
  undefined1 auVar271 [32];
  float fVar280;
  float fVar284;
  float fVar288;
  float fVar292;
  float fVar296;
  float fVar300;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar289;
  float fVar293;
  float fVar297;
  undefined1 auVar276 [64];
  float fVar302;
  undefined1 auVar303 [16];
  float fVar301;
  undefined1 auVar304 [16];
  float fVar311;
  float fVar313;
  float fVar319;
  float fVar322;
  float fVar325;
  undefined1 auVar305 [32];
  float fVar312;
  float fVar314;
  float fVar316;
  float fVar317;
  float fVar320;
  float fVar323;
  float fVar326;
  undefined1 auVar306 [32];
  float fVar315;
  float fVar318;
  float fVar321;
  float fVar324;
  float fVar327;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  vint4 ai_1;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar335;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  undefined1 auVar336 [16];
  undefined1 auVar337 [28];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar341;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar347 [16];
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar348 [32];
  float fVar352;
  float fVar355;
  float fVar356;
  undefined1 auVar353 [16];
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar354 [32];
  float fVar361;
  float fVar371;
  float fVar372;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar373;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar378 [16];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar382;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_c69;
  undefined1 local_c40 [32];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  undefined8 *local_a88;
  undefined8 *local_a80;
  undefined1 (*local_a78) [32];
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  Primitive *local_8f8;
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  ulong local_740;
  undefined1 auStack_738 [24];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar3 = prim[1];
  uVar81 = (ulong)(byte)PVar3;
  lVar83 = uVar81 * 0x19;
  fVar177 = *(float *)(prim + lVar83 + 0x12);
  auVar120 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar120 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar120 = vsubps_avx(auVar120,*(undefined1 (*) [16])(prim + lVar83 + 6));
  auVar117._0_4_ = fVar177 * auVar120._0_4_;
  auVar117._4_4_ = fVar177 * auVar120._4_4_;
  auVar117._8_4_ = fVar177 * auVar120._8_4_;
  auVar117._12_4_ = fVar177 * auVar120._12_4_;
  auVar234._0_4_ = fVar177 * auVar8._0_4_;
  auVar234._4_4_ = fVar177 * auVar8._4_4_;
  auVar234._8_4_ = fVar177 * auVar8._8_4_;
  auVar234._12_4_ = fVar177 * auVar8._12_4_;
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar303 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar303 = vcvtdq2ps_avx(auVar303);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar81 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar163 = vcvtdq2ps_avx(auVar163);
  uVar78 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + uVar81 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar78 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar86 = vshufps_avx(auVar234,auVar234,0);
  auVar118 = vshufps_avx(auVar234,auVar234,0x55);
  auVar158 = vshufps_avx(auVar234,auVar234,0xaa);
  fVar177 = auVar158._0_4_;
  fVar202 = auVar158._4_4_;
  fVar231 = auVar158._8_4_;
  fVar192 = auVar158._12_4_;
  fVar253 = auVar118._0_4_;
  fVar196 = auVar118._4_4_;
  fVar226 = auVar118._8_4_;
  fVar256 = auVar118._12_4_;
  fVar222 = auVar86._0_4_;
  fVar250 = auVar86._4_4_;
  fVar194 = auVar86._8_4_;
  fVar224 = auVar86._12_4_;
  auVar353._0_4_ = fVar222 * auVar120._0_4_ + fVar253 * auVar8._0_4_ + fVar177 * auVar129._0_4_;
  auVar353._4_4_ = fVar250 * auVar120._4_4_ + fVar196 * auVar8._4_4_ + fVar202 * auVar129._4_4_;
  auVar353._8_4_ = fVar194 * auVar120._8_4_ + fVar226 * auVar8._8_4_ + fVar231 * auVar129._8_4_;
  auVar353._12_4_ = fVar224 * auVar120._12_4_ + fVar256 * auVar8._12_4_ + fVar192 * auVar129._12_4_;
  auVar362._0_4_ = fVar222 * auVar303._0_4_ + fVar253 * auVar95._0_4_ + auVar163._0_4_ * fVar177;
  auVar362._4_4_ = fVar250 * auVar303._4_4_ + fVar196 * auVar95._4_4_ + auVar163._4_4_ * fVar202;
  auVar362._8_4_ = fVar194 * auVar303._8_4_ + fVar226 * auVar95._8_4_ + auVar163._8_4_ * fVar231;
  auVar362._12_4_ = fVar224 * auVar303._12_4_ + fVar256 * auVar95._12_4_ + auVar163._12_4_ * fVar192
  ;
  auVar235._0_4_ = fVar222 * auVar87._0_4_ + fVar253 * auVar88._0_4_ + auVar119._0_4_ * fVar177;
  auVar235._4_4_ = fVar250 * auVar87._4_4_ + fVar196 * auVar88._4_4_ + auVar119._4_4_ * fVar202;
  auVar235._8_4_ = fVar194 * auVar87._8_4_ + fVar226 * auVar88._8_4_ + auVar119._8_4_ * fVar231;
  auVar235._12_4_ = fVar224 * auVar87._12_4_ + fVar256 * auVar88._12_4_ + auVar119._12_4_ * fVar192;
  auVar86 = vshufps_avx(auVar117,auVar117,0);
  auVar118 = vshufps_avx(auVar117,auVar117,0x55);
  auVar158 = vshufps_avx(auVar117,auVar117,0xaa);
  fVar177 = auVar158._0_4_;
  fVar202 = auVar158._4_4_;
  fVar231 = auVar158._8_4_;
  fVar192 = auVar158._12_4_;
  fVar253 = auVar118._0_4_;
  fVar196 = auVar118._4_4_;
  fVar226 = auVar118._8_4_;
  fVar256 = auVar118._12_4_;
  fVar222 = auVar86._0_4_;
  fVar250 = auVar86._4_4_;
  fVar194 = auVar86._8_4_;
  fVar224 = auVar86._12_4_;
  auVar267._0_4_ = fVar222 * auVar120._0_4_ + fVar253 * auVar8._0_4_ + fVar177 * auVar129._0_4_;
  auVar267._4_4_ = fVar250 * auVar120._4_4_ + fVar196 * auVar8._4_4_ + fVar202 * auVar129._4_4_;
  auVar267._8_4_ = fVar194 * auVar120._8_4_ + fVar226 * auVar8._8_4_ + fVar231 * auVar129._8_4_;
  auVar267._12_4_ = fVar224 * auVar120._12_4_ + fVar256 * auVar8._12_4_ + fVar192 * auVar129._12_4_;
  auVar86._0_4_ = fVar222 * auVar303._0_4_ + auVar163._0_4_ * fVar177 + fVar253 * auVar95._0_4_;
  auVar86._4_4_ = fVar250 * auVar303._4_4_ + auVar163._4_4_ * fVar202 + fVar196 * auVar95._4_4_;
  auVar86._8_4_ = fVar194 * auVar303._8_4_ + auVar163._8_4_ * fVar231 + fVar226 * auVar95._8_4_;
  auVar86._12_4_ = fVar224 * auVar303._12_4_ + auVar163._12_4_ * fVar192 + fVar256 * auVar95._12_4_;
  auVar328._8_4_ = 0x7fffffff;
  auVar328._0_8_ = 0x7fffffff7fffffff;
  auVar328._12_4_ = 0x7fffffff;
  auVar120 = vandps_avx(auVar353,auVar328);
  auVar204._8_4_ = 0x219392ef;
  auVar204._0_8_ = 0x219392ef219392ef;
  auVar204._12_4_ = 0x219392ef;
  auVar120 = vcmpps_avx(auVar120,auVar204,1);
  auVar8 = vblendvps_avx(auVar353,auVar204,auVar120);
  auVar120 = vandps_avx(auVar362,auVar328);
  auVar120 = vcmpps_avx(auVar120,auVar204,1);
  auVar129 = vblendvps_avx(auVar362,auVar204,auVar120);
  auVar120 = vandps_avx(auVar328,auVar235);
  auVar120 = vcmpps_avx(auVar120,auVar204,1);
  auVar120 = vblendvps_avx(auVar235,auVar204,auVar120);
  auVar118._0_4_ = fVar222 * auVar87._0_4_ + fVar253 * auVar88._0_4_ + auVar119._0_4_ * fVar177;
  auVar118._4_4_ = fVar250 * auVar87._4_4_ + fVar196 * auVar88._4_4_ + auVar119._4_4_ * fVar202;
  auVar118._8_4_ = fVar194 * auVar87._8_4_ + fVar226 * auVar88._8_4_ + auVar119._8_4_ * fVar231;
  auVar118._12_4_ = fVar224 * auVar87._12_4_ + fVar256 * auVar88._12_4_ + auVar119._12_4_ * fVar192;
  auVar303 = vrcpps_avx(auVar8);
  fVar177 = auVar303._0_4_;
  auVar178._0_4_ = fVar177 * auVar8._0_4_;
  fVar192 = auVar303._4_4_;
  auVar178._4_4_ = fVar192 * auVar8._4_4_;
  fVar194 = auVar303._8_4_;
  auVar178._8_4_ = fVar194 * auVar8._8_4_;
  fVar196 = auVar303._12_4_;
  auVar178._12_4_ = fVar196 * auVar8._12_4_;
  auVar329._8_4_ = 0x3f800000;
  auVar329._0_8_ = &DAT_3f8000003f800000;
  auVar329._12_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar329,auVar178);
  fVar177 = fVar177 + fVar177 * auVar8._0_4_;
  fVar192 = fVar192 + fVar192 * auVar8._4_4_;
  fVar194 = fVar194 + fVar194 * auVar8._8_4_;
  fVar196 = fVar196 + fVar196 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar129);
  fVar202 = auVar8._0_4_;
  auVar205._0_4_ = fVar202 * auVar129._0_4_;
  fVar222 = auVar8._4_4_;
  auVar205._4_4_ = fVar222 * auVar129._4_4_;
  fVar224 = auVar8._8_4_;
  auVar205._8_4_ = fVar224 * auVar129._8_4_;
  fVar226 = auVar8._12_4_;
  auVar205._12_4_ = fVar226 * auVar129._12_4_;
  auVar8 = vsubps_avx(auVar329,auVar205);
  fVar202 = fVar202 + fVar202 * auVar8._0_4_;
  fVar222 = fVar222 + fVar222 * auVar8._4_4_;
  fVar224 = fVar224 + fVar224 * auVar8._8_4_;
  fVar226 = fVar226 + fVar226 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar120);
  fVar231 = auVar8._0_4_;
  auVar236._0_4_ = fVar231 * auVar120._0_4_;
  fVar250 = auVar8._4_4_;
  auVar236._4_4_ = fVar250 * auVar120._4_4_;
  fVar253 = auVar8._8_4_;
  auVar236._8_4_ = fVar253 * auVar120._8_4_;
  fVar256 = auVar8._12_4_;
  auVar236._12_4_ = fVar256 * auVar120._12_4_;
  auVar8 = vsubps_avx(auVar329,auVar236);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar120 = vpmovsxwd_avx(auVar120);
  fVar231 = fVar231 + fVar231 * auVar8._0_4_;
  fVar250 = fVar250 + fVar250 * auVar8._4_4_;
  fVar253 = fVar253 + fVar253 * auVar8._8_4_;
  fVar256 = fVar256 + fVar256 * auVar8._12_4_;
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,auVar267);
  auVar158._0_4_ = fVar177 * auVar120._0_4_;
  auVar158._4_4_ = fVar192 * auVar120._4_4_;
  auVar158._8_4_ = fVar194 * auVar120._8_4_;
  auVar158._12_4_ = fVar196 * auVar120._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar120 = vpmovsxwd_avx(auVar8);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,auVar267);
  auVar179._0_4_ = fVar177 * auVar120._0_4_;
  auVar179._4_4_ = fVar192 * auVar120._4_4_;
  auVar179._8_4_ = fVar194 * auVar120._8_4_;
  auVar179._12_4_ = fVar196 * auVar120._12_4_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar129);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar81 * -2 + 6);
  auVar120 = vpmovsxwd_avx(auVar303);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,auVar86);
  auVar330._0_4_ = auVar120._0_4_ * fVar202;
  auVar330._4_4_ = auVar120._4_4_ * fVar222;
  auVar330._8_4_ = auVar120._8_4_ * fVar224;
  auVar330._12_4_ = auVar120._12_4_ * fVar226;
  auVar120 = vcvtdq2ps_avx(auVar8);
  auVar120 = vsubps_avx(auVar120,auVar86);
  auVar87._0_4_ = fVar202 * auVar120._0_4_;
  auVar87._4_4_ = fVar222 * auVar120._4_4_;
  auVar87._8_4_ = fVar224 * auVar120._8_4_;
  auVar87._12_4_ = fVar226 * auVar120._12_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar78 + uVar81 + 6);
  auVar120 = vpmovsxwd_avx(auVar95);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,auVar118);
  auVar206._0_4_ = auVar120._0_4_ * fVar231;
  auVar206._4_4_ = auVar120._4_4_ * fVar250;
  auVar206._8_4_ = auVar120._8_4_ * fVar253;
  auVar206._12_4_ = auVar120._12_4_ * fVar256;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar120 = vpmovsxwd_avx(auVar163);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,auVar118);
  auVar119._0_4_ = auVar120._0_4_ * fVar231;
  auVar119._4_4_ = auVar120._4_4_ * fVar250;
  auVar119._8_4_ = auVar120._8_4_ * fVar253;
  auVar119._12_4_ = auVar120._12_4_ * fVar256;
  auVar120 = vpminsd_avx(auVar158,auVar179);
  auVar8 = vpminsd_avx(auVar330,auVar87);
  auVar120 = vmaxps_avx(auVar120,auVar8);
  auVar8 = vpminsd_avx(auVar206,auVar119);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar336._4_4_ = uVar1;
  auVar336._0_4_ = uVar1;
  auVar336._8_4_ = uVar1;
  auVar336._12_4_ = uVar1;
  auVar8 = vmaxps_avx(auVar8,auVar336);
  auVar120 = vmaxps_avx(auVar120,auVar8);
  local_5f0._0_4_ = auVar120._0_4_ * 0.99999964;
  local_5f0._4_4_ = auVar120._4_4_ * 0.99999964;
  local_5f0._8_4_ = auVar120._8_4_ * 0.99999964;
  local_5f0._12_4_ = auVar120._12_4_ * 0.99999964;
  auVar120 = vpmaxsd_avx(auVar158,auVar179);
  auVar8 = vpmaxsd_avx(auVar330,auVar87);
  auVar120 = vminps_avx(auVar120,auVar8);
  auVar8 = vpmaxsd_avx(auVar206,auVar119);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar159._4_4_ = uVar1;
  auVar159._0_4_ = uVar1;
  auVar159._8_4_ = uVar1;
  auVar159._12_4_ = uVar1;
  auVar8 = vminps_avx(auVar8,auVar159);
  auVar120 = vminps_avx(auVar120,auVar8);
  auVar88._0_4_ = auVar120._0_4_ * 1.0000004;
  auVar88._4_4_ = auVar120._4_4_ * 1.0000004;
  auVar88._8_4_ = auVar120._8_4_ * 1.0000004;
  auVar88._12_4_ = auVar120._12_4_ * 1.0000004;
  auVar120 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar8 = vpcmpgtd_avx(auVar120,_DAT_01ff0cf0);
  auVar120 = vcmpps_avx(local_5f0,auVar88,2);
  auVar120 = vandps_avx(auVar120,auVar8);
  uVar80 = vmovmskps_avx(auVar120);
  local_c69 = uVar80 != 0;
  if (uVar80 == 0) {
    return local_c69;
  }
  uVar80 = uVar80 & 0xff;
  local_8f8 = prim + lVar83 + 0x16;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_440 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  uVar82 = 1 << ((byte)k & 0x1f);
  local_a78 = (undefined1 (*) [32])&local_500;
  local_a80 = (undefined8 *)(mm_lookupmask_ps + ((uVar82 & 0xf) << 4));
  local_a88 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar82 >> 4) * 0x10);
  local_8f0 = prim;
LAB_00eca8c8:
  local_8e8 = (ulong)uVar80;
  lVar83 = 0;
  if (local_8e8 != 0) {
    for (; (uVar80 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
    }
  }
  local_8e8 = local_8e8 - 1 & local_8e8;
  lVar79 = lVar83 * 0x40;
  lVar7 = 0;
  if (local_8e8 != 0) {
    for (; (local_8e8 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  uVar80 = *(uint *)(local_8f0 + 2);
  auVar120 = *(undefined1 (*) [16])(local_8f8 + lVar79);
  if (((local_8e8 != 0) && (uVar81 = local_8e8 - 1 & local_8e8, uVar81 != 0)) &&
     (lVar7 = 0, uVar81 != 0)) {
    for (; (uVar81 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar8 = *(undefined1 (*) [16])(local_8f8 + lVar79 + 0x10);
  auVar129 = *(undefined1 (*) [16])(local_8f8 + lVar79 + 0x20);
  auVar303 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar163 = vinsertps_avx(auVar303,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar177 = *(float *)(ray + k * 4 + 0x80);
  auVar347._4_4_ = fVar177;
  auVar347._0_4_ = fVar177;
  auVar347._8_4_ = fVar177;
  auVar347._12_4_ = fVar177;
  fStack_af0 = fVar177;
  _local_b00 = auVar347;
  fStack_aec = fVar177;
  fStack_ae8 = fVar177;
  fStack_ae4 = fVar177;
  auVar303 = *(undefined1 (*) [16])(local_8f8 + lVar79 + 0x30);
  fVar202 = *(float *)(ray + k * 4 + 0xa0);
  auVar363._4_4_ = fVar202;
  auVar363._0_4_ = fVar202;
  auVar363._8_4_ = fVar202;
  auVar363._12_4_ = fVar202;
  fStack_9f0 = fVar202;
  _local_a00 = auVar363;
  fStack_9ec = fVar202;
  fStack_9e8 = fVar202;
  fStack_9e4 = fVar202;
  auVar95 = vunpcklps_avx(auVar347,auVar363);
  fVar231 = *(float *)(ray + k * 4 + 0xc0);
  auVar378._4_4_ = fVar231;
  auVar378._0_4_ = fVar231;
  auVar378._8_4_ = fVar231;
  auVar378._12_4_ = fVar231;
  fStack_970 = fVar231;
  _local_980 = auVar378;
  fStack_96c = fVar231;
  fStack_968 = fVar231;
  fStack_964 = fVar231;
  _local_9b0 = vinsertps_avx(auVar95,auVar378,0x28);
  auVar89._0_4_ = (auVar120._0_4_ + auVar8._0_4_ + auVar129._0_4_ + auVar303._0_4_) * 0.25;
  auVar89._4_4_ = (auVar120._4_4_ + auVar8._4_4_ + auVar129._4_4_ + auVar303._4_4_) * 0.25;
  auVar89._8_4_ = (auVar120._8_4_ + auVar8._8_4_ + auVar129._8_4_ + auVar303._8_4_) * 0.25;
  auVar89._12_4_ = (auVar120._12_4_ + auVar8._12_4_ + auVar129._12_4_ + auVar303._12_4_) * 0.25;
  auVar95 = vsubps_avx(auVar89,auVar163);
  auVar95 = vdpps_avx(auVar95,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar87 = vrcpss_avx(local_9c0,local_9c0);
  fVar192 = auVar95._0_4_ * auVar87._0_4_ * (2.0 - local_9c0._0_4_ * auVar87._0_4_);
  auVar95 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
  local_9e0 = auVar95._0_4_;
  fStack_9dc = auVar95._4_4_;
  fStack_9d8 = auVar95._8_4_;
  fStack_9d4 = auVar95._12_4_;
  auVar207._0_4_ = auVar163._0_4_ + local_9b0._0_4_ * local_9e0;
  auVar207._4_4_ = auVar163._4_4_ + local_9b0._4_4_ * fStack_9dc;
  auVar207._8_4_ = auVar163._8_4_ + local_9b0._8_4_ * fStack_9d8;
  auVar207._12_4_ = auVar163._12_4_ + local_9b0._12_4_ * fStack_9d4;
  auVar95 = vblendps_avx(auVar207,_DAT_01feba10,8);
  _local_b30 = vsubps_avx(auVar120,auVar95);
  _local_b40 = vsubps_avx(auVar129,auVar95);
  auVar191 = ZEXT1664(_local_b40);
  _local_b50 = vsubps_avx(auVar8,auVar95);
  auVar334 = ZEXT1664(_local_b50);
  _local_b60 = vsubps_avx(auVar303,auVar95);
  auVar221 = ZEXT1664(_local_b60);
  auVar120 = vshufps_avx(_local_b30,_local_b30,0);
  local_2a0._16_16_ = auVar120;
  local_2a0._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001250 = auVar120;
  _local_1a0 = auVar120;
  auVar120 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001250 = auVar120;
  _local_1c0 = auVar120;
  auVar120 = vshufps_avx(_local_b30,_local_b30,0xff);
  local_2c0._16_16_ = auVar120;
  local_2c0._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b50,_local_b50,0);
  local_2e0._16_16_ = auVar120;
  local_2e0._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b50,_local_b50,0x55);
  local_300._16_16_ = auVar120;
  local_300._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b50,_local_b50,0xaa);
  local_320._16_16_ = auVar120;
  local_320._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b50,_local_b50,0xff);
  local_820._16_16_ = auVar120;
  local_820._0_16_ = auVar120;
  auVar276 = ZEXT3264(local_820);
  auVar120 = vshufps_avx(_local_b40,_local_b40,0);
  local_340._16_16_ = auVar120;
  local_340._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b40,_local_b40,0x55);
  local_360._16_16_ = auVar120;
  local_360._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b40,_local_b40,0xaa);
  local_380._16_16_ = auVar120;
  local_380._0_16_ = auVar120;
  auVar120 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar120;
  _local_1e0 = auVar120;
  auVar120 = vshufps_avx(_local_b60,_local_b60,0);
  register0x00001290 = auVar120;
  _local_200 = auVar120;
  auVar120 = vshufps_avx(_local_b60,_local_b60,0x55);
  register0x00001290 = auVar120;
  _local_220 = auVar120;
  auVar120 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar120;
  _local_240 = auVar120;
  auVar120 = vshufps_avx(_local_b60,_local_b60,0xff);
  register0x00001290 = auVar120;
  _local_260 = auVar120;
  auVar120 = ZEXT416((uint)(fVar177 * fVar177 + fVar202 * fVar202 + fVar231 * fVar231));
  auVar120 = vshufps_avx(auVar120,auVar120,0);
  local_280._16_16_ = auVar120;
  local_280._0_16_ = auVar120;
  fVar177 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)fVar192);
  auVar120 = vshufps_avx(ZEXT416((uint)(fVar177 - fVar192)),ZEXT416((uint)(fVar177 - fVar192)),0);
  local_3a0._16_16_ = auVar120;
  local_3a0._0_16_ = auVar120;
  auVar120 = vshufps_avx(ZEXT416(uVar80),ZEXT416(uVar80),0);
  local_480._16_16_ = auVar120;
  local_480._0_16_ = auVar120;
  auVar120 = vpshufd_avx(ZEXT416(*(uint *)(local_8f0 + lVar83 * 4 + 6)),0);
  local_4a0._16_16_ = auVar120;
  local_4a0._0_16_ = auVar120;
  uVar81 = 1;
  uVar78 = 0;
  uVar85 = 0;
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_280,auVar100);
  auVar120 = vsqrtss_avx(local_9c0,local_9c0);
  auVar8 = vsqrtss_avx(local_9c0,local_9c0);
  local_910 = ZEXT816(0x3f80000000000000);
  fStack_9d0 = local_9e0;
  fStack_9cc = fStack_9dc;
  fStack_9c8 = fStack_9d8;
  fStack_9c4 = fStack_9d4;
  do {
    auVar129 = vmovshdup_avx(local_910);
    fVar253 = auVar129._0_4_ - local_910._0_4_;
    auVar129 = vshufps_avx(local_910,local_910,0);
    local_780._16_16_ = auVar129;
    local_780._0_16_ = auVar129;
    auVar303 = vshufps_avx(ZEXT416((uint)fVar253),ZEXT416((uint)fVar253),0);
    local_7a0._16_16_ = auVar303;
    local_7a0._0_16_ = auVar303;
    fVar258 = auVar303._0_4_;
    fVar260 = auVar303._4_4_;
    fVar263 = auVar303._8_4_;
    fVar153 = auVar303._12_4_;
    fVar233 = auVar129._0_4_;
    auVar132._0_4_ = fVar233 + fVar258 * 0.0;
    fVar252 = auVar129._4_4_;
    auVar132._4_4_ = fVar252 + fVar260 * 0.14285715;
    fVar255 = auVar129._8_4_;
    auVar132._8_4_ = fVar255 + fVar263 * 0.2857143;
    fVar113 = auVar129._12_4_;
    auVar132._12_4_ = fVar113 + fVar153 * 0.42857146;
    auVar132._16_4_ = fVar233 + fVar258 * 0.5714286;
    auVar132._20_4_ = fVar252 + fVar260 * 0.71428573;
    auVar132._24_4_ = fVar255 + fVar263 * 0.8571429;
    auVar132._28_4_ = fVar113 + fVar153;
    auVar167._8_4_ = 0x3f800000;
    auVar167._0_8_ = &DAT_3f8000003f800000;
    auVar167._12_4_ = 0x3f800000;
    auVar167._16_4_ = 0x3f800000;
    auVar167._20_4_ = 0x3f800000;
    auVar167._24_4_ = 0x3f800000;
    auVar167._28_4_ = 0x3f800000;
    auVar105 = vsubps_avx(auVar167,auVar132);
    fVar202 = auVar105._0_4_;
    fVar231 = auVar105._4_4_;
    fVar192 = auVar105._8_4_;
    fVar222 = auVar105._12_4_;
    fVar250 = auVar105._16_4_;
    fVar194 = auVar105._20_4_;
    fVar224 = auVar105._24_4_;
    fVar201 = auVar191._28_4_;
    fVar335 = auVar334._28_4_ + fVar201;
    fVar196 = local_2c0._28_4_;
    fVar226 = local_340._0_4_ * auVar132._0_4_ + local_2e0._0_4_ * fVar202;
    fVar277 = local_340._4_4_ * auVar132._4_4_ + local_2e0._4_4_ * fVar231;
    fVar281 = local_340._8_4_ * auVar132._8_4_ + local_2e0._8_4_ * fVar192;
    fVar285 = local_340._12_4_ * auVar132._12_4_ + local_2e0._12_4_ * fVar222;
    fVar289 = local_340._16_4_ * auVar132._16_4_ + local_2e0._16_4_ * fVar250;
    fVar293 = local_340._20_4_ * auVar132._20_4_ + local_2e0._20_4_ * fVar194;
    fVar297 = local_340._24_4_ * auVar132._24_4_ + local_2e0._24_4_ * fVar224;
    fVar256 = local_360._0_4_ * auVar132._0_4_ + local_300._0_4_ * fVar202;
    fVar193 = local_360._4_4_ * auVar132._4_4_ + local_300._4_4_ * fVar231;
    fVar195 = local_360._8_4_ * auVar132._8_4_ + local_300._8_4_ * fVar192;
    fVar197 = local_360._12_4_ * auVar132._12_4_ + local_300._12_4_ * fVar222;
    fVar198 = local_360._16_4_ * auVar132._16_4_ + local_300._16_4_ * fVar250;
    fVar199 = local_360._20_4_ * auVar132._20_4_ + local_300._20_4_ * fVar194;
    fVar200 = local_360._24_4_ * auVar132._24_4_ + local_300._24_4_ * fVar224;
    fVar203 = local_380._0_4_ * auVar132._0_4_ + local_320._0_4_ * fVar202;
    fVar223 = local_380._4_4_ * auVar132._4_4_ + local_320._4_4_ * fVar231;
    fVar225 = local_380._8_4_ * auVar132._8_4_ + local_320._8_4_ * fVar192;
    fVar227 = local_380._12_4_ * auVar132._12_4_ + local_320._12_4_ * fVar222;
    fVar228 = local_380._16_4_ * auVar132._16_4_ + local_320._16_4_ * fVar250;
    fVar229 = local_380._20_4_ * auVar132._20_4_ + local_320._20_4_ * fVar194;
    fVar230 = local_380._24_4_ * auVar132._24_4_ + local_320._24_4_ * fVar224;
    fVar232 = (float)local_1e0._0_4_ * auVar132._0_4_ + local_820._0_4_ * fVar202;
    fVar251 = (float)local_1e0._4_4_ * auVar132._4_4_ + local_820._4_4_ * fVar231;
    fVar254 = fStack_1d8 * auVar132._8_4_ + local_820._8_4_ * fVar192;
    fVar257 = fStack_1d4 * auVar132._12_4_ + local_820._12_4_ * fVar222;
    fVar259 = fStack_1d0 * auVar132._16_4_ + local_820._16_4_ * fVar250;
    fVar261 = fStack_1cc * auVar132._20_4_ + local_820._20_4_ * fVar194;
    fVar262 = fStack_1c8 * auVar132._24_4_ + local_820._24_4_ * fVar224;
    fVar377 = fVar196 + local_340._28_4_;
    auVar338._0_4_ =
         fVar202 * (local_2e0._0_4_ * auVar132._0_4_ + local_2a0._0_4_ * fVar202) +
         auVar132._0_4_ * fVar226;
    auVar338._4_4_ =
         fVar231 * (local_2e0._4_4_ * auVar132._4_4_ + local_2a0._4_4_ * fVar231) +
         auVar132._4_4_ * fVar277;
    auVar338._8_4_ =
         fVar192 * (local_2e0._8_4_ * auVar132._8_4_ + local_2a0._8_4_ * fVar192) +
         auVar132._8_4_ * fVar281;
    auVar338._12_4_ =
         fVar222 * (local_2e0._12_4_ * auVar132._12_4_ + local_2a0._12_4_ * fVar222) +
         auVar132._12_4_ * fVar285;
    auVar338._16_4_ =
         fVar250 * (local_2e0._16_4_ * auVar132._16_4_ + local_2a0._16_4_ * fVar250) +
         auVar132._16_4_ * fVar289;
    auVar338._20_4_ =
         fVar194 * (local_2e0._20_4_ * auVar132._20_4_ + local_2a0._20_4_ * fVar194) +
         auVar132._20_4_ * fVar293;
    auVar338._24_4_ =
         fVar224 * (local_2e0._24_4_ * auVar132._24_4_ + local_2a0._24_4_ * fVar224) +
         auVar132._24_4_ * fVar297;
    auVar338._28_4_ = local_360._28_4_ + fVar196;
    auVar342._0_4_ =
         fVar202 * (local_300._0_4_ * auVar132._0_4_ + fVar202 * (float)local_1a0._0_4_) +
         auVar132._0_4_ * fVar256;
    auVar342._4_4_ =
         fVar231 * (local_300._4_4_ * auVar132._4_4_ + fVar231 * (float)local_1a0._4_4_) +
         auVar132._4_4_ * fVar193;
    auVar342._8_4_ =
         fVar192 * (local_300._8_4_ * auVar132._8_4_ + fVar192 * fStack_198) +
         auVar132._8_4_ * fVar195;
    auVar342._12_4_ =
         fVar222 * (local_300._12_4_ * auVar132._12_4_ + fVar222 * fStack_194) +
         auVar132._12_4_ * fVar197;
    auVar342._16_4_ =
         fVar250 * (local_300._16_4_ * auVar132._16_4_ + fVar250 * fStack_190) +
         auVar132._16_4_ * fVar198;
    auVar342._20_4_ =
         fVar194 * (local_300._20_4_ * auVar132._20_4_ + fVar194 * fStack_18c) +
         auVar132._20_4_ * fVar199;
    auVar342._24_4_ =
         fVar224 * (local_300._24_4_ * auVar132._24_4_ + fVar224 * fStack_188) +
         auVar132._24_4_ * fVar200;
    auVar342._28_4_ = local_820._28_4_ + fVar196;
    auVar348._0_4_ =
         (local_320._0_4_ * auVar132._0_4_ + fVar202 * (float)local_1c0._0_4_) * fVar202 +
         auVar132._0_4_ * fVar203;
    auVar348._4_4_ =
         (local_320._4_4_ * auVar132._4_4_ + fVar231 * (float)local_1c0._4_4_) * fVar231 +
         auVar132._4_4_ * fVar223;
    auVar348._8_4_ =
         (local_320._8_4_ * auVar132._8_4_ + fVar192 * fStack_1b8) * fVar192 +
         auVar132._8_4_ * fVar225;
    auVar348._12_4_ =
         (local_320._12_4_ * auVar132._12_4_ + fVar222 * fStack_1b4) * fVar222 +
         auVar132._12_4_ * fVar227;
    auVar348._16_4_ =
         (local_320._16_4_ * auVar132._16_4_ + fVar250 * fStack_1b0) * fVar250 +
         auVar132._16_4_ * fVar228;
    auVar348._20_4_ =
         (local_320._20_4_ * auVar132._20_4_ + fVar194 * fStack_1ac) * fVar194 +
         auVar132._20_4_ * fVar229;
    auVar348._24_4_ =
         (local_320._24_4_ * auVar132._24_4_ + fVar224 * fStack_1a8) * fVar224 +
         auVar132._24_4_ * fVar230;
    auVar348._28_4_ = fVar335 + fVar196;
    auVar305._0_4_ =
         auVar132._0_4_ * fVar232 +
         fVar202 * (local_820._0_4_ * auVar132._0_4_ + local_2c0._0_4_ * fVar202);
    auVar305._4_4_ =
         auVar132._4_4_ * fVar251 +
         fVar231 * (local_820._4_4_ * auVar132._4_4_ + local_2c0._4_4_ * fVar231);
    auVar305._8_4_ =
         auVar132._8_4_ * fVar254 +
         fVar192 * (local_820._8_4_ * auVar132._8_4_ + local_2c0._8_4_ * fVar192);
    auVar305._12_4_ =
         auVar132._12_4_ * fVar257 +
         fVar222 * (local_820._12_4_ * auVar132._12_4_ + local_2c0._12_4_ * fVar222);
    auVar305._16_4_ =
         auVar132._16_4_ * fVar259 +
         fVar250 * (local_820._16_4_ * auVar132._16_4_ + local_2c0._16_4_ * fVar250);
    auVar305._20_4_ =
         auVar132._20_4_ * fVar261 +
         fVar194 * (local_820._20_4_ * auVar132._20_4_ + local_2c0._20_4_ * fVar194);
    auVar305._24_4_ =
         auVar132._24_4_ * fVar262 +
         fVar224 * (local_820._24_4_ * auVar132._24_4_ + local_2c0._24_4_ * fVar224);
    auVar305._28_4_ = fVar335 + fVar196 + local_2a0._28_4_;
    auVar270._0_4_ =
         (auVar132._0_4_ * (float)local_200._0_4_ + local_340._0_4_ * fVar202) * auVar132._0_4_ +
         fVar202 * fVar226;
    auVar270._4_4_ =
         (auVar132._4_4_ * (float)local_200._4_4_ + local_340._4_4_ * fVar231) * auVar132._4_4_ +
         fVar231 * fVar277;
    auVar270._8_4_ =
         (auVar132._8_4_ * fStack_1f8 + local_340._8_4_ * fVar192) * auVar132._8_4_ +
         fVar192 * fVar281;
    auVar270._12_4_ =
         (auVar132._12_4_ * fStack_1f4 + local_340._12_4_ * fVar222) * auVar132._12_4_ +
         fVar222 * fVar285;
    auVar270._16_4_ =
         (auVar132._16_4_ * fStack_1f0 + local_340._16_4_ * fVar250) * auVar132._16_4_ +
         fVar250 * fVar289;
    auVar270._20_4_ =
         (auVar132._20_4_ * fStack_1ec + local_340._20_4_ * fVar194) * auVar132._20_4_ +
         fVar194 * fVar293;
    auVar270._24_4_ =
         (auVar132._24_4_ * fStack_1e8 + local_340._24_4_ * fVar224) * auVar132._24_4_ +
         fVar224 * fVar297;
    auVar270._28_4_ = fVar335 + fVar201 + auVar276._28_4_;
    fVar226 = local_380._28_4_;
    auVar187._0_4_ =
         auVar132._0_4_ * (local_360._0_4_ * fVar202 + auVar132._0_4_ * (float)local_220._0_4_) +
         fVar202 * fVar256;
    auVar187._4_4_ =
         auVar132._4_4_ * (local_360._4_4_ * fVar231 + auVar132._4_4_ * (float)local_220._4_4_) +
         fVar231 * fVar193;
    auVar187._8_4_ =
         auVar132._8_4_ * (local_360._8_4_ * fVar192 + auVar132._8_4_ * fStack_218) +
         fVar192 * fVar195;
    auVar187._12_4_ =
         auVar132._12_4_ * (local_360._12_4_ * fVar222 + auVar132._12_4_ * fStack_214) +
         fVar222 * fVar197;
    auVar187._16_4_ =
         auVar132._16_4_ * (local_360._16_4_ * fVar250 + auVar132._16_4_ * fStack_210) +
         fVar250 * fVar198;
    auVar187._20_4_ =
         auVar132._20_4_ * (local_360._20_4_ * fVar194 + auVar132._20_4_ * fStack_20c) +
         fVar194 * fVar199;
    auVar187._24_4_ =
         auVar132._24_4_ * (local_360._24_4_ * fVar224 + auVar132._24_4_ * fStack_208) +
         fVar224 * fVar200;
    auVar187._28_4_ = fVar335 + auVar221._28_4_ + fVar201;
    auVar217._0_4_ =
         (auVar132._0_4_ * (float)local_240._0_4_ + local_380._0_4_ * fVar202) * auVar132._0_4_ +
         fVar202 * fVar203;
    auVar217._4_4_ =
         (auVar132._4_4_ * (float)local_240._4_4_ + local_380._4_4_ * fVar231) * auVar132._4_4_ +
         fVar231 * fVar223;
    auVar217._8_4_ =
         (auVar132._8_4_ * fStack_238 + local_380._8_4_ * fVar192) * auVar132._8_4_ +
         fVar192 * fVar225;
    auVar217._12_4_ =
         (auVar132._12_4_ * fStack_234 + local_380._12_4_ * fVar222) * auVar132._12_4_ +
         fVar222 * fVar227;
    auVar217._16_4_ =
         (auVar132._16_4_ * fStack_230 + local_380._16_4_ * fVar250) * auVar132._16_4_ +
         fVar250 * fVar228;
    auVar217._20_4_ =
         (auVar132._20_4_ * fStack_22c + local_380._20_4_ * fVar194) * auVar132._20_4_ +
         fVar194 * fVar229;
    auVar217._24_4_ =
         (auVar132._24_4_ * fStack_228 + local_380._24_4_ * fVar224) * auVar132._24_4_ +
         fVar224 * fVar230;
    auVar217._28_4_ = fVar226 + local_2a0._28_4_ + auVar221._28_4_;
    auVar242._0_4_ =
         (auVar132._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar202) *
         auVar132._0_4_ + fVar202 * fVar232;
    auVar242._4_4_ =
         (auVar132._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar231) *
         auVar132._4_4_ + fVar231 * fVar251;
    auVar242._8_4_ =
         (auVar132._8_4_ * fStack_258 + fStack_1d8 * fVar192) * auVar132._8_4_ + fVar192 * fVar254;
    auVar242._12_4_ =
         (auVar132._12_4_ * fStack_254 + fStack_1d4 * fVar222) * auVar132._12_4_ + fVar222 * fVar257
    ;
    auVar242._16_4_ =
         (auVar132._16_4_ * fStack_250 + fStack_1d0 * fVar250) * auVar132._16_4_ + fVar250 * fVar259
    ;
    auVar242._20_4_ =
         (auVar132._20_4_ * fStack_24c + fStack_1cc * fVar194) * auVar132._20_4_ + fVar194 * fVar261
    ;
    auVar242._24_4_ =
         (auVar132._24_4_ * fStack_248 + fStack_1c8 * fVar224) * auVar132._24_4_ + fVar224 * fVar262
    ;
    auVar242._28_4_ = fVar377 + fVar196 + local_320._28_4_;
    auVar364._0_4_ = auVar338._0_4_ * fVar202 + auVar132._0_4_ * auVar270._0_4_;
    auVar364._4_4_ = auVar338._4_4_ * fVar231 + auVar132._4_4_ * auVar270._4_4_;
    auVar364._8_4_ = auVar338._8_4_ * fVar192 + auVar132._8_4_ * auVar270._8_4_;
    auVar364._12_4_ = auVar338._12_4_ * fVar222 + auVar132._12_4_ * auVar270._12_4_;
    auVar364._16_4_ = auVar338._16_4_ * fVar250 + auVar132._16_4_ * auVar270._16_4_;
    auVar364._20_4_ = auVar338._20_4_ * fVar194 + auVar132._20_4_ * auVar270._20_4_;
    auVar364._24_4_ = auVar338._24_4_ * fVar224 + auVar132._24_4_ * auVar270._24_4_;
    auVar364._28_4_ = fVar377 + fVar335;
    auVar379._0_4_ = auVar342._0_4_ * fVar202 + auVar132._0_4_ * auVar187._0_4_;
    auVar379._4_4_ = auVar342._4_4_ * fVar231 + auVar132._4_4_ * auVar187._4_4_;
    auVar379._8_4_ = auVar342._8_4_ * fVar192 + auVar132._8_4_ * auVar187._8_4_;
    auVar379._12_4_ = auVar342._12_4_ * fVar222 + auVar132._12_4_ * auVar187._12_4_;
    auVar379._16_4_ = auVar342._16_4_ * fVar250 + auVar132._16_4_ * auVar187._16_4_;
    auVar379._20_4_ = auVar342._20_4_ * fVar194 + auVar132._20_4_ * auVar187._20_4_;
    auVar379._24_4_ = auVar342._24_4_ * fVar224 + auVar132._24_4_ * auVar187._24_4_;
    auVar379._28_4_ = fVar335 + fVar226;
    auVar383._0_4_ = auVar348._0_4_ * fVar202 + auVar132._0_4_ * auVar217._0_4_;
    auVar383._4_4_ = auVar348._4_4_ * fVar231 + auVar132._4_4_ * auVar217._4_4_;
    auVar383._8_4_ = auVar348._8_4_ * fVar192 + auVar132._8_4_ * auVar217._8_4_;
    auVar383._12_4_ = auVar348._12_4_ * fVar222 + auVar132._12_4_ * auVar217._12_4_;
    auVar383._16_4_ = auVar348._16_4_ * fVar250 + auVar132._16_4_ * auVar217._16_4_;
    auVar383._20_4_ = auVar348._20_4_ * fVar194 + auVar132._20_4_ * auVar217._20_4_;
    auVar383._24_4_ = auVar348._24_4_ * fVar224 + auVar132._24_4_ * auVar217._24_4_;
    auVar383._28_4_ = fVar226 + fVar335;
    local_7c0._0_4_ = fVar202 * auVar305._0_4_ + auVar132._0_4_ * auVar242._0_4_;
    local_7c0._4_4_ = fVar231 * auVar305._4_4_ + auVar132._4_4_ * auVar242._4_4_;
    local_7c0._8_4_ = fVar192 * auVar305._8_4_ + auVar132._8_4_ * auVar242._8_4_;
    local_7c0._12_4_ = fVar222 * auVar305._12_4_ + auVar132._12_4_ * auVar242._12_4_;
    local_7c0._16_4_ = fVar250 * auVar305._16_4_ + auVar132._16_4_ * auVar242._16_4_;
    local_7c0._20_4_ = fVar194 * auVar305._20_4_ + auVar132._20_4_ * auVar242._20_4_;
    local_7c0._24_4_ = fVar224 * auVar305._24_4_ + auVar132._24_4_ * auVar242._24_4_;
    local_7c0._28_4_ = auVar105._28_4_ + auVar132._28_4_;
    auVar10 = vsubps_avx(auVar270,auVar338);
    auVar105 = vsubps_avx(auVar187,auVar342);
    auVar100 = vsubps_avx(auVar217,auVar348);
    auVar11 = vsubps_avx(auVar242,auVar305);
    auVar129 = vshufps_avx(ZEXT416((uint)(fVar253 * 0.04761905)),
                           ZEXT416((uint)(fVar253 * 0.04761905)),0);
    fVar199 = auVar129._0_4_;
    fVar264 = fVar199 * auVar10._0_4_ * 3.0;
    fVar223 = auVar129._4_4_;
    fVar278 = fVar223 * auVar10._4_4_ * 3.0;
    auVar16._4_4_ = fVar278;
    auVar16._0_4_ = fVar264;
    fVar225 = auVar129._8_4_;
    fVar282 = fVar225 * auVar10._8_4_ * 3.0;
    auVar16._8_4_ = fVar282;
    fVar198 = auVar129._12_4_;
    fVar286 = fVar198 * auVar10._12_4_ * 3.0;
    auVar16._12_4_ = fVar286;
    fVar290 = fVar199 * auVar10._16_4_ * 3.0;
    auVar16._16_4_ = fVar290;
    fVar294 = fVar223 * auVar10._20_4_ * 3.0;
    auVar16._20_4_ = fVar294;
    fVar298 = fVar225 * auVar10._24_4_ * 3.0;
    auVar16._24_4_ = fVar298;
    auVar16._28_4_ = auVar270._28_4_;
    fVar301 = fVar199 * auVar105._0_4_ * 3.0;
    fVar311 = fVar223 * auVar105._4_4_ * 3.0;
    auVar17._4_4_ = fVar311;
    auVar17._0_4_ = fVar301;
    fVar313 = fVar225 * auVar105._8_4_ * 3.0;
    auVar17._8_4_ = fVar313;
    fVar316 = fVar198 * auVar105._12_4_ * 3.0;
    auVar17._12_4_ = fVar316;
    fVar319 = fVar199 * auVar105._16_4_ * 3.0;
    auVar17._16_4_ = fVar319;
    fVar322 = fVar223 * auVar105._20_4_ * 3.0;
    auVar17._20_4_ = fVar322;
    fVar325 = fVar225 * auVar105._24_4_ * 3.0;
    auVar17._24_4_ = fVar325;
    auVar17._28_4_ = auVar305._28_4_;
    fVar352 = fVar199 * auVar100._0_4_ * 3.0;
    fVar355 = fVar223 * auVar100._4_4_ * 3.0;
    auVar15._4_4_ = fVar355;
    auVar15._0_4_ = fVar352;
    fVar356 = fVar225 * auVar100._8_4_ * 3.0;
    auVar15._8_4_ = fVar356;
    fVar357 = fVar198 * auVar100._12_4_ * 3.0;
    auVar15._12_4_ = fVar357;
    fVar358 = fVar199 * auVar100._16_4_ * 3.0;
    auVar15._16_4_ = fVar358;
    fVar359 = fVar223 * auVar100._20_4_ * 3.0;
    auVar15._20_4_ = fVar359;
    fVar360 = fVar225 * auVar100._24_4_ * 3.0;
    auVar15._24_4_ = fVar360;
    auVar15._28_4_ = fVar226;
    fVar250 = fVar199 * auVar11._0_4_ * 3.0;
    fVar194 = fVar223 * auVar11._4_4_ * 3.0;
    auVar12._4_4_ = fVar194;
    auVar12._0_4_ = fVar250;
    fVar256 = fVar225 * auVar11._8_4_ * 3.0;
    auVar12._8_4_ = fVar256;
    fVar198 = fVar198 * auVar11._12_4_ * 3.0;
    auVar12._12_4_ = fVar198;
    fVar199 = fVar199 * auVar11._16_4_ * 3.0;
    auVar12._16_4_ = fVar199;
    fVar223 = fVar223 * auVar11._20_4_ * 3.0;
    auVar12._20_4_ = fVar223;
    fVar225 = fVar225 * auVar11._24_4_ * 3.0;
    auVar12._24_4_ = fVar225;
    auVar12._28_4_ = auVar10._28_4_;
    auVar105 = vperm2f128_avx(auVar379,auVar379,1);
    auVar105 = vshufps_avx(auVar105,auVar379,0x30);
    local_ac0 = vshufps_avx(auVar379,auVar105,0x29);
    auVar105 = vperm2f128_avx(auVar383,auVar383,1);
    auVar105 = vshufps_avx(auVar105,auVar383,0x30);
    _local_ae0 = vshufps_avx(auVar383,auVar105,0x29);
    auVar100 = vsubps_avx(local_7c0,auVar12);
    auVar105 = vperm2f128_avx(auVar100,auVar100,1);
    auVar105 = vshufps_avx(auVar105,auVar100,0x30);
    local_7e0 = vshufps_avx(auVar100,auVar105,0x29);
    auVar11 = vsubps_avx(local_ac0,auVar379);
    auVar12 = vsubps_avx(_local_ae0,auVar383);
    fVar231 = auVar11._0_4_;
    fVar224 = auVar11._4_4_;
    auVar369._4_4_ = fVar355 * fVar224;
    auVar369._0_4_ = fVar352 * fVar231;
    fVar193 = auVar11._8_4_;
    auVar369._8_4_ = fVar356 * fVar193;
    fVar200 = auVar11._12_4_;
    auVar369._12_4_ = fVar357 * fVar200;
    fVar227 = auVar11._16_4_;
    auVar369._16_4_ = fVar358 * fVar227;
    fVar251 = auVar11._20_4_;
    auVar369._20_4_ = fVar359 * fVar251;
    fVar262 = auVar11._24_4_;
    auVar369._24_4_ = fVar360 * fVar262;
    auVar369._28_4_ = auVar100._28_4_;
    fVar192 = auVar12._0_4_;
    fVar253 = auVar12._4_4_;
    auVar11._4_4_ = fVar311 * fVar253;
    auVar11._0_4_ = fVar301 * fVar192;
    fVar195 = auVar12._8_4_;
    auVar11._8_4_ = fVar313 * fVar195;
    fVar201 = auVar12._12_4_;
    auVar11._12_4_ = fVar316 * fVar201;
    fVar228 = auVar12._16_4_;
    auVar11._16_4_ = fVar319 * fVar228;
    fVar254 = auVar12._20_4_;
    auVar11._20_4_ = fVar322 * fVar254;
    fVar277 = auVar12._24_4_;
    auVar11._24_4_ = fVar325 * fVar277;
    auVar11._28_4_ = auVar105._28_4_;
    auVar12 = vsubps_avx(auVar11,auVar369);
    auVar105 = vperm2f128_avx(auVar364,auVar364,1);
    auVar105 = vshufps_avx(auVar105,auVar364,0x30);
    auVar11 = vshufps_avx(auVar364,auVar105,0x29);
    auVar105 = vsubps_avx(auVar11,auVar364);
    auVar13._4_4_ = fVar278 * fVar253;
    auVar13._0_4_ = fVar264 * fVar192;
    auVar13._8_4_ = fVar282 * fVar195;
    auVar13._12_4_ = fVar286 * fVar201;
    auVar13._16_4_ = fVar290 * fVar228;
    auVar13._20_4_ = fVar294 * fVar254;
    auVar13._24_4_ = fVar298 * fVar277;
    auVar13._28_4_ = auVar11._28_4_;
    fVar222 = auVar105._0_4_;
    fVar196 = auVar105._4_4_;
    auVar14._4_4_ = fVar355 * fVar196;
    auVar14._0_4_ = fVar352 * fVar222;
    fVar197 = auVar105._8_4_;
    auVar14._8_4_ = fVar356 * fVar197;
    fVar203 = auVar105._12_4_;
    auVar14._12_4_ = fVar357 * fVar203;
    fVar229 = auVar105._16_4_;
    auVar14._16_4_ = fVar358 * fVar229;
    fVar257 = auVar105._20_4_;
    auVar14._20_4_ = fVar359 * fVar257;
    fVar281 = auVar105._24_4_;
    auVar14._24_4_ = fVar360 * fVar281;
    auVar14._28_4_ = local_ae0._28_4_;
    auVar369 = vsubps_avx(auVar14,auVar13);
    auVar332._4_4_ = fVar196 * fVar311;
    auVar332._0_4_ = fVar222 * fVar301;
    auVar332._8_4_ = fVar197 * fVar313;
    auVar332._12_4_ = fVar203 * fVar316;
    auVar332._16_4_ = fVar229 * fVar319;
    auVar332._20_4_ = fVar257 * fVar322;
    auVar332._24_4_ = fVar281 * fVar325;
    auVar332._28_4_ = local_ae0._28_4_;
    auVar368._4_4_ = fVar224 * fVar278;
    auVar368._0_4_ = fVar231 * fVar264;
    auVar368._8_4_ = fVar193 * fVar282;
    auVar368._12_4_ = fVar200 * fVar286;
    auVar368._16_4_ = fVar227 * fVar290;
    auVar368._20_4_ = fVar251 * fVar294;
    auVar368._24_4_ = fVar262 * fVar298;
    auVar368._28_4_ = auVar342._28_4_;
    auVar13 = vsubps_avx(auVar368,auVar332);
    fVar202 = auVar13._28_4_;
    fVar230 = auVar369._28_4_ + fVar202;
    auVar188._0_4_ = fVar222 * fVar222 + fVar231 * fVar231 + fVar192 * fVar192;
    auVar188._4_4_ = fVar196 * fVar196 + fVar224 * fVar224 + fVar253 * fVar253;
    auVar188._8_4_ = fVar197 * fVar197 + fVar193 * fVar193 + fVar195 * fVar195;
    auVar188._12_4_ = fVar203 * fVar203 + fVar200 * fVar200 + fVar201 * fVar201;
    auVar188._16_4_ = fVar229 * fVar229 + fVar227 * fVar227 + fVar228 * fVar228;
    auVar188._20_4_ = fVar257 * fVar257 + fVar251 * fVar251 + fVar254 * fVar254;
    auVar188._24_4_ = fVar281 * fVar281 + fVar262 * fVar262 + fVar277 * fVar277;
    auVar188._28_4_ = fVar202 + fVar202 + fVar230;
    auVar105 = vrcpps_avx(auVar188);
    fVar232 = auVar105._0_4_;
    fVar259 = auVar105._4_4_;
    auVar9._4_4_ = fVar259 * auVar188._4_4_;
    auVar9._0_4_ = fVar232 * auVar188._0_4_;
    fVar261 = auVar105._8_4_;
    auVar9._8_4_ = fVar261 * auVar188._8_4_;
    fVar285 = auVar105._12_4_;
    auVar9._12_4_ = fVar285 * auVar188._12_4_;
    fVar289 = auVar105._16_4_;
    auVar9._16_4_ = fVar289 * auVar188._16_4_;
    fVar293 = auVar105._20_4_;
    auVar9._20_4_ = fVar293 * auVar188._20_4_;
    fVar297 = auVar105._24_4_;
    auVar9._24_4_ = fVar297 * auVar188._24_4_;
    auVar9._28_4_ = auVar342._28_4_;
    auVar365._8_4_ = 0x3f800000;
    auVar365._0_8_ = &DAT_3f8000003f800000;
    auVar365._12_4_ = 0x3f800000;
    auVar365._16_4_ = 0x3f800000;
    auVar365._20_4_ = 0x3f800000;
    auVar365._24_4_ = 0x3f800000;
    auVar365._28_4_ = 0x3f800000;
    auVar14 = vsubps_avx(auVar365,auVar9);
    fVar232 = auVar14._0_4_ * fVar232 + fVar232;
    fVar259 = auVar14._4_4_ * fVar259 + fVar259;
    fVar261 = auVar14._8_4_ * fVar261 + fVar261;
    fVar285 = auVar14._12_4_ * fVar285 + fVar285;
    fVar289 = auVar14._16_4_ * fVar289 + fVar289;
    fVar293 = auVar14._20_4_ * fVar293 + fVar293;
    fVar297 = auVar14._24_4_ * fVar297 + fVar297;
    auVar100 = vperm2f128_avx(auVar17,auVar17,1);
    auVar100 = vshufps_avx(auVar100,auVar17,0x30);
    local_960 = vshufps_avx(auVar17,auVar100,0x29);
    auVar100 = vperm2f128_avx(auVar15,auVar15,1);
    auVar100 = vshufps_avx(auVar100,auVar15,0x30);
    local_a20 = vshufps_avx(auVar15,auVar100,0x29);
    fVar361 = local_a20._0_4_;
    fVar371 = local_a20._4_4_;
    auVar18._4_4_ = fVar371 * fVar224;
    auVar18._0_4_ = fVar361 * fVar231;
    fVar372 = local_a20._8_4_;
    auVar18._8_4_ = fVar372 * fVar193;
    fVar373 = local_a20._12_4_;
    auVar18._12_4_ = fVar373 * fVar200;
    fVar374 = local_a20._16_4_;
    auVar18._16_4_ = fVar374 * fVar227;
    fVar375 = local_a20._20_4_;
    auVar18._20_4_ = fVar375 * fVar251;
    fVar376 = local_a20._24_4_;
    auVar18._24_4_ = fVar376 * fVar262;
    auVar18._28_4_ = auVar100._28_4_;
    fVar302 = local_960._0_4_;
    fVar312 = local_960._4_4_;
    auVar19._4_4_ = fVar312 * fVar253;
    auVar19._0_4_ = fVar302 * fVar192;
    fVar314 = local_960._8_4_;
    auVar19._8_4_ = fVar314 * fVar195;
    fVar317 = local_960._12_4_;
    auVar19._12_4_ = fVar317 * fVar201;
    fVar320 = local_960._16_4_;
    auVar19._16_4_ = fVar320 * fVar228;
    fVar323 = local_960._20_4_;
    auVar19._20_4_ = fVar323 * fVar254;
    fVar326 = local_960._24_4_;
    auVar19._24_4_ = fVar326 * fVar277;
    auVar19._28_4_ = fVar226;
    auVar15 = vsubps_avx(auVar19,auVar18);
    auVar100 = vperm2f128_avx(auVar16,auVar16,1);
    auVar100 = vshufps_avx(auVar100,auVar16,0x30);
    local_9a0 = vshufps_avx(auVar16,auVar100,0x29);
    fVar265 = local_9a0._0_4_;
    fVar279 = local_9a0._4_4_;
    auVar20._4_4_ = fVar279 * fVar253;
    auVar20._0_4_ = fVar265 * fVar192;
    fVar283 = local_9a0._8_4_;
    auVar20._8_4_ = fVar283 * fVar195;
    fVar287 = local_9a0._12_4_;
    auVar20._12_4_ = fVar287 * fVar201;
    fVar291 = local_9a0._16_4_;
    auVar20._16_4_ = fVar291 * fVar228;
    fVar295 = local_9a0._20_4_;
    auVar20._20_4_ = fVar295 * fVar254;
    fVar299 = local_9a0._24_4_;
    auVar20._24_4_ = fVar299 * fVar277;
    auVar20._28_4_ = auVar100._28_4_;
    auVar21._4_4_ = fVar371 * fVar196;
    auVar21._0_4_ = fVar361 * fVar222;
    auVar21._8_4_ = fVar372 * fVar197;
    auVar21._12_4_ = fVar373 * fVar203;
    auVar21._16_4_ = fVar374 * fVar229;
    auVar21._20_4_ = fVar375 * fVar257;
    uVar82 = local_a20._28_4_;
    auVar21._24_4_ = fVar376 * fVar281;
    auVar21._28_4_ = uVar82;
    auVar16 = vsubps_avx(auVar21,auVar20);
    auVar22._4_4_ = fVar196 * fVar312;
    auVar22._0_4_ = fVar222 * fVar302;
    auVar22._8_4_ = fVar197 * fVar314;
    auVar22._12_4_ = fVar203 * fVar317;
    auVar22._16_4_ = fVar229 * fVar320;
    auVar22._20_4_ = fVar257 * fVar323;
    auVar22._24_4_ = fVar281 * fVar326;
    auVar22._28_4_ = uVar82;
    auVar23._4_4_ = fVar224 * fVar279;
    auVar23._0_4_ = fVar231 * fVar265;
    auVar23._8_4_ = fVar193 * fVar283;
    auVar23._12_4_ = fVar200 * fVar287;
    auVar23._16_4_ = fVar227 * fVar291;
    auVar23._20_4_ = fVar251 * fVar295;
    auVar23._24_4_ = fVar262 * fVar299;
    auVar23._28_4_ = auVar379._28_4_;
    auVar100 = vsubps_avx(auVar23,auVar22);
    fVar202 = auVar100._28_4_;
    auVar24._4_4_ =
         (auVar12._4_4_ * auVar12._4_4_ +
         auVar369._4_4_ * auVar369._4_4_ + auVar13._4_4_ * auVar13._4_4_) * fVar259;
    auVar24._0_4_ =
         (auVar12._0_4_ * auVar12._0_4_ +
         auVar369._0_4_ * auVar369._0_4_ + auVar13._0_4_ * auVar13._0_4_) * fVar232;
    auVar24._8_4_ =
         (auVar12._8_4_ * auVar12._8_4_ +
         auVar369._8_4_ * auVar369._8_4_ + auVar13._8_4_ * auVar13._8_4_) * fVar261;
    auVar24._12_4_ =
         (auVar12._12_4_ * auVar12._12_4_ +
         auVar369._12_4_ * auVar369._12_4_ + auVar13._12_4_ * auVar13._12_4_) * fVar285;
    auVar24._16_4_ =
         (auVar12._16_4_ * auVar12._16_4_ +
         auVar369._16_4_ * auVar369._16_4_ + auVar13._16_4_ * auVar13._16_4_) * fVar289;
    auVar24._20_4_ =
         (auVar12._20_4_ * auVar12._20_4_ +
         auVar369._20_4_ * auVar369._20_4_ + auVar13._20_4_ * auVar13._20_4_) * fVar293;
    auVar24._24_4_ =
         (auVar12._24_4_ * auVar12._24_4_ +
         auVar369._24_4_ * auVar369._24_4_ + auVar13._24_4_ * auVar13._24_4_) * fVar297;
    auVar24._28_4_ = auVar12._28_4_ + fVar230;
    auVar25._4_4_ =
         (auVar15._4_4_ * auVar15._4_4_ +
         auVar16._4_4_ * auVar16._4_4_ + auVar100._4_4_ * auVar100._4_4_) * fVar259;
    auVar25._0_4_ =
         (auVar15._0_4_ * auVar15._0_4_ +
         auVar16._0_4_ * auVar16._0_4_ + auVar100._0_4_ * auVar100._0_4_) * fVar232;
    auVar25._8_4_ =
         (auVar15._8_4_ * auVar15._8_4_ +
         auVar16._8_4_ * auVar16._8_4_ + auVar100._8_4_ * auVar100._8_4_) * fVar261;
    auVar25._12_4_ =
         (auVar15._12_4_ * auVar15._12_4_ +
         auVar16._12_4_ * auVar16._12_4_ + auVar100._12_4_ * auVar100._12_4_) * fVar285;
    auVar25._16_4_ =
         (auVar15._16_4_ * auVar15._16_4_ +
         auVar16._16_4_ * auVar16._16_4_ + auVar100._16_4_ * auVar100._16_4_) * fVar289;
    auVar25._20_4_ =
         (auVar15._20_4_ * auVar15._20_4_ +
         auVar16._20_4_ * auVar16._20_4_ + auVar100._20_4_ * auVar100._20_4_) * fVar293;
    auVar25._24_4_ =
         (auVar15._24_4_ * auVar15._24_4_ +
         auVar16._24_4_ * auVar16._24_4_ + auVar100._24_4_ * auVar100._24_4_) * fVar297;
    auVar25._28_4_ = auVar14._28_4_ + auVar105._28_4_;
    auVar105 = vmaxps_avx(auVar24,auVar25);
    auVar100 = vperm2f128_avx(local_7c0,local_7c0,1);
    auVar100 = vshufps_avx(auVar100,local_7c0,0x30);
    local_800 = vshufps_avx(local_7c0,auVar100,0x29);
    auVar133._0_4_ = (float)local_7c0._0_4_ + fVar250;
    auVar133._4_4_ = local_7c0._4_4_ + fVar194;
    auVar133._8_4_ = local_7c0._8_4_ + fVar256;
    auVar133._12_4_ = local_7c0._12_4_ + fVar198;
    auVar133._16_4_ = local_7c0._16_4_ + fVar199;
    auVar133._20_4_ = local_7c0._20_4_ + fVar223;
    auVar133._24_4_ = local_7c0._24_4_ + fVar225;
    auVar133._28_4_ = local_7c0._28_4_ + auVar10._28_4_;
    auVar100 = vmaxps_avx(local_7c0,auVar133);
    auVar10 = vmaxps_avx(local_7e0,local_800);
    auVar100 = vmaxps_avx(auVar100,auVar10);
    auVar10 = vrsqrtps_avx(auVar188);
    fVar250 = auVar10._0_4_;
    fVar194 = auVar10._4_4_;
    fVar226 = auVar10._8_4_;
    fVar256 = auVar10._12_4_;
    fVar198 = auVar10._16_4_;
    fVar199 = auVar10._20_4_;
    fVar223 = auVar10._24_4_;
    fVar341 = fVar250 * 1.5 + fVar250 * fVar250 * fVar250 * auVar188._0_4_ * -0.5;
    fVar344 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar188._4_4_ * -0.5;
    fVar345 = fVar226 * 1.5 + fVar226 * fVar226 * fVar226 * auVar188._8_4_ * -0.5;
    fVar346 = fVar256 * 1.5 + fVar256 * fVar256 * fVar256 * auVar188._12_4_ * -0.5;
    fStack_750 = fVar198 * 1.5 + fVar198 * fVar198 * fVar198 * auVar188._16_4_ * -0.5;
    fStack_74c = fVar199 * 1.5 + fVar199 * fVar199 * fVar199 * auVar188._20_4_ * -0.5;
    fStack_748 = fVar223 * 1.5 + fVar223 * fVar223 * fVar223 * auVar188._24_4_ * -0.5;
    fStack_744 = auVar10._28_4_ + auVar188._28_4_;
    auVar59 = ZEXT412(0);
    auVar334 = ZEXT1264(auVar59) << 0x20;
    auVar12 = vsubps_avx(ZEXT1232(auVar59) << 0x20,auVar379);
    auVar369 = vsubps_avx(ZEXT1232(auVar59) << 0x20,auVar383);
    fVar382 = auVar369._0_4_;
    fVar385 = auVar369._4_4_;
    fVar386 = auVar369._8_4_;
    fVar387 = auVar369._12_4_;
    fVar388 = auVar369._16_4_;
    fVar389 = auVar369._20_4_;
    fVar390 = auVar369._24_4_;
    fVar250 = auVar12._0_4_;
    fVar226 = auVar12._4_4_;
    fVar198 = auVar12._8_4_;
    fVar223 = auVar12._12_4_;
    fVar230 = auVar12._16_4_;
    fVar259 = auVar12._20_4_;
    fVar285 = auVar12._24_4_;
    auVar332 = ZEXT1232(auVar59) << 0x20;
    auVar369 = vsubps_avx(auVar332,auVar364);
    fVar194 = auVar369._0_4_;
    fVar256 = auVar369._4_4_;
    fVar199 = auVar369._8_4_;
    fVar225 = auVar369._12_4_;
    fVar232 = auVar369._16_4_;
    fVar261 = auVar369._20_4_;
    fVar289 = auVar369._24_4_;
    auVar354._0_4_ =
         (float)local_b00._0_4_ * fVar194 +
         (float)local_a00._0_4_ * fVar250 + fVar382 * (float)local_980._0_4_;
    auVar354._4_4_ =
         (float)local_b00._4_4_ * fVar256 +
         (float)local_a00._4_4_ * fVar226 + fVar385 * (float)local_980._4_4_;
    auVar354._8_4_ = fStack_af8 * fVar199 + fStack_9f8 * fVar198 + fVar386 * fStack_978;
    auVar354._12_4_ = fStack_af4 * fVar225 + fStack_9f4 * fVar223 + fVar387 * fStack_974;
    auVar354._16_4_ = fStack_af0 * fVar232 + fStack_9f0 * fVar230 + fVar388 * fStack_970;
    auVar354._20_4_ = fStack_aec * fVar261 + fStack_9ec * fVar259 + fVar389 * fStack_96c;
    auVar354._24_4_ = fStack_ae8 * fVar289 + fStack_9e8 * fVar285 + fVar390 * fStack_968;
    auVar354._28_4_ = fVar202 + auVar16._28_4_ + fVar202 + auVar10._28_4_;
    auVar366._0_4_ = fVar194 * fVar194 + fVar250 * fVar250 + fVar382 * fVar382;
    auVar366._4_4_ = fVar256 * fVar256 + fVar226 * fVar226 + fVar385 * fVar385;
    auVar366._8_4_ = fVar199 * fVar199 + fVar198 * fVar198 + fVar386 * fVar386;
    auVar366._12_4_ = fVar225 * fVar225 + fVar223 * fVar223 + fVar387 * fVar387;
    auVar366._16_4_ = fVar232 * fVar232 + fVar230 * fVar230 + fVar388 * fVar388;
    auVar366._20_4_ = fVar261 * fVar261 + fVar259 * fVar259 + fVar389 * fVar389;
    auVar366._24_4_ = fVar289 * fVar289 + fVar285 * fVar285 + fVar390 * fVar390;
    auVar366._28_4_ = auVar379._28_4_ + auVar379._28_4_ + fVar202;
    fVar293 = (float)local_b00._0_4_ * fVar222 * fVar341 +
              fVar231 * fVar341 * (float)local_a00._0_4_ +
              fVar341 * fVar192 * (float)local_980._0_4_;
    fVar297 = (float)local_b00._4_4_ * fVar196 * fVar344 +
              fVar224 * fVar344 * (float)local_a00._4_4_ +
              fVar344 * fVar253 * (float)local_980._4_4_;
    fVar335 = fStack_af8 * fVar197 * fVar345 +
              fVar193 * fVar345 * fStack_9f8 + fVar345 * fVar195 * fStack_978;
    fVar377 = fStack_af4 * fVar203 * fVar346 +
              fVar200 * fVar346 * fStack_9f4 + fVar346 * fVar201 * fStack_974;
    fVar114 = fStack_af0 * fVar229 * fStack_750 +
              fVar227 * fStack_750 * fStack_9f0 + fStack_750 * fVar228 * fStack_970;
    fVar115 = fStack_aec * fVar257 * fStack_74c +
              fVar251 * fStack_74c * fStack_9ec + fStack_74c * fVar254 * fStack_96c;
    fVar116 = fStack_ae8 * fVar281 * fStack_748 +
              fVar262 * fStack_748 * fStack_9e8 + fStack_748 * fVar277 * fStack_968;
    fVar202 = fStack_ae4 + fStack_9e4 + fStack_964;
    local_4c0 = fVar194 * fVar222 * fVar341 +
                fVar231 * fVar341 * fVar250 + fVar382 * fVar341 * fVar192;
    fStack_4bc = fVar256 * fVar196 * fVar344 +
                 fVar224 * fVar344 * fVar226 + fVar385 * fVar344 * fVar253;
    fStack_4b8 = fVar199 * fVar197 * fVar345 +
                 fVar193 * fVar345 * fVar198 + fVar386 * fVar345 * fVar195;
    fStack_4b4 = fVar225 * fVar203 * fVar346 +
                 fVar200 * fVar346 * fVar223 + fVar387 * fVar346 * fVar201;
    fStack_4b0 = fVar232 * fVar229 * fStack_750 +
                 fVar227 * fStack_750 * fVar230 + fVar388 * fStack_750 * fVar228;
    fStack_4ac = fVar261 * fVar257 * fStack_74c +
                 fVar251 * fStack_74c * fVar259 + fVar389 * fStack_74c * fVar254;
    fStack_4a8 = fVar289 * fVar281 * fStack_748 +
                 fVar262 * fStack_748 * fVar285 + fVar390 * fStack_748 * fVar277;
    fStack_4a4 = fStack_9e4 + fVar202;
    auVar10._4_4_ = fVar297 * fStack_4bc;
    auVar10._0_4_ = fVar293 * local_4c0;
    auVar10._8_4_ = fVar335 * fStack_4b8;
    auVar10._12_4_ = fVar377 * fStack_4b4;
    auVar10._16_4_ = fVar114 * fStack_4b0;
    auVar10._20_4_ = fVar115 * fStack_4ac;
    auVar10._24_4_ = fVar116 * fStack_4a8;
    auVar10._28_4_ = fVar202;
    auVar13 = vsubps_avx(auVar354,auVar10);
    auVar26._4_4_ = fStack_4bc * fStack_4bc;
    auVar26._0_4_ = local_4c0 * local_4c0;
    auVar26._8_4_ = fStack_4b8 * fStack_4b8;
    auVar26._12_4_ = fStack_4b4 * fStack_4b4;
    auVar26._16_4_ = fStack_4b0 * fStack_4b0;
    auVar26._20_4_ = fStack_4ac * fStack_4ac;
    auVar26._24_4_ = fStack_4a8 * fStack_4a8;
    auVar26._28_4_ = fStack_9e4;
    auVar14 = vsubps_avx(auVar366,auVar26);
    auVar10 = vsqrtps_avx(auVar105);
    fVar202 = (auVar10._0_4_ + auVar100._0_4_) * 1.0000002;
    fVar151 = (auVar10._4_4_ + auVar100._4_4_) * 1.0000002;
    fVar152 = (auVar10._8_4_ + auVar100._8_4_) * 1.0000002;
    fVar154 = (auVar10._12_4_ + auVar100._12_4_) * 1.0000002;
    fVar155 = (auVar10._16_4_ + auVar100._16_4_) * 1.0000002;
    fVar156 = (auVar10._20_4_ + auVar100._20_4_) * 1.0000002;
    fVar157 = (auVar10._24_4_ + auVar100._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar151 * fVar151;
    auVar27._0_4_ = fVar202 * fVar202;
    auVar27._8_4_ = fVar152 * fVar152;
    auVar27._12_4_ = fVar154 * fVar154;
    auVar27._16_4_ = fVar155 * fVar155;
    auVar27._20_4_ = fVar156 * fVar156;
    auVar27._24_4_ = fVar157 * fVar157;
    auVar27._28_4_ = auVar10._28_4_ + auVar100._28_4_;
    fVar151 = auVar13._0_4_ + auVar13._0_4_;
    fVar152 = auVar13._4_4_ + auVar13._4_4_;
    local_b20._0_8_ = CONCAT44(fVar152,fVar151);
    local_b20._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    local_b20._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    local_b20._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    local_b20._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    local_b20._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    local_b20._28_4_ = auVar13._28_4_ + auVar13._28_4_;
    auVar100 = vsubps_avx(auVar14,auVar27);
    auVar28._4_4_ = fVar297 * fVar297;
    auVar28._0_4_ = fVar293 * fVar293;
    auVar28._8_4_ = fVar335 * fVar335;
    auVar28._12_4_ = fVar377 * fVar377;
    auVar28._16_4_ = fVar114 * fVar114;
    auVar28._20_4_ = fVar115 * fVar115;
    auVar28._24_4_ = fVar116 * fVar116;
    auVar28._28_4_ = fStack_744;
    auVar13 = vsubps_avx(local_280,auVar28);
    auVar29._4_4_ = fVar152 * fVar152;
    auVar29._0_4_ = fVar151 * fVar151;
    auVar29._8_4_ = local_b20._8_4_ * local_b20._8_4_;
    auVar29._12_4_ = local_b20._12_4_ * local_b20._12_4_;
    auVar29._16_4_ = local_b20._16_4_ * local_b20._16_4_;
    auVar29._20_4_ = local_b20._20_4_ * local_b20._20_4_;
    auVar29._24_4_ = local_b20._24_4_ * local_b20._24_4_;
    auVar29._28_4_ = local_280._28_4_;
    fVar154 = auVar13._0_4_;
    fVar155 = auVar13._4_4_;
    fVar156 = auVar13._8_4_;
    fVar157 = auVar13._12_4_;
    fVar349 = auVar13._16_4_;
    fVar350 = auVar13._20_4_;
    fVar351 = auVar13._24_4_;
    auVar30._4_4_ = fVar155 * 4.0 * auVar100._4_4_;
    auVar30._0_4_ = fVar154 * 4.0 * auVar100._0_4_;
    auVar30._8_4_ = fVar156 * 4.0 * auVar100._8_4_;
    auVar30._12_4_ = fVar157 * 4.0 * auVar100._12_4_;
    auVar30._16_4_ = fVar349 * 4.0 * auVar100._16_4_;
    auVar30._20_4_ = fVar350 * 4.0 * auVar100._20_4_;
    auVar30._24_4_ = fVar351 * 4.0 * auVar100._24_4_;
    auVar30._28_4_ = 0x40800000;
    auVar15 = vsubps_avx(auVar29,auVar30);
    auVar105 = vcmpps_avx(auVar15,auVar332,5);
    fVar202 = auVar13._28_4_;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      local_c40._8_4_ = 0x7f800000;
      local_c40._0_8_ = 0x7f8000007f800000;
      local_c40._12_4_ = 0x7f800000;
      local_c40._16_4_ = 0x7f800000;
      local_c40._20_4_ = 0x7f800000;
      local_c40._24_4_ = 0x7f800000;
      local_c40._28_4_ = 0x7f800000;
      auVar380._8_4_ = 0xff800000;
      auVar380._0_8_ = 0xff800000ff800000;
      auVar380._12_4_ = 0xff800000;
      auVar380._16_4_ = 0xff800000;
      auVar380._20_4_ = 0xff800000;
      auVar380._24_4_ = 0xff800000;
      auVar380._28_4_ = 0xff800000;
    }
    else {
      auVar9 = vsqrtps_avx(auVar15);
      auVar271._0_4_ = fVar154 + fVar154;
      auVar271._4_4_ = fVar155 + fVar155;
      auVar271._8_4_ = fVar156 + fVar156;
      auVar271._12_4_ = fVar157 + fVar157;
      auVar271._16_4_ = fVar349 + fVar349;
      auVar271._20_4_ = fVar350 + fVar350;
      auVar271._24_4_ = fVar351 + fVar351;
      auVar271._28_4_ = fVar202 + fVar202;
      auVar368 = vrcpps_avx(auVar271);
      auVar16 = vcmpps_avx(auVar15,auVar332,5);
      fVar266 = auVar368._0_4_;
      fVar280 = auVar368._4_4_;
      auVar31._4_4_ = auVar271._4_4_ * fVar280;
      auVar31._0_4_ = auVar271._0_4_ * fVar266;
      fVar284 = auVar368._8_4_;
      auVar31._8_4_ = auVar271._8_4_ * fVar284;
      fVar288 = auVar368._12_4_;
      auVar31._12_4_ = auVar271._12_4_ * fVar288;
      fVar292 = auVar368._16_4_;
      auVar31._16_4_ = auVar271._16_4_ * fVar292;
      fVar296 = auVar368._20_4_;
      auVar31._20_4_ = auVar271._20_4_ * fVar296;
      fVar300 = auVar368._24_4_;
      auVar31._24_4_ = auVar271._24_4_ * fVar300;
      auVar31._28_4_ = auVar271._28_4_;
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar101._16_4_ = 0x3f800000;
      auVar101._20_4_ = 0x3f800000;
      auVar101._24_4_ = 0x3f800000;
      auVar101._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar101,auVar31);
      fVar266 = fVar266 + fVar266 * auVar15._0_4_;
      fVar280 = fVar280 + fVar280 * auVar15._4_4_;
      fVar284 = fVar284 + fVar284 * auVar15._8_4_;
      fVar288 = fVar288 + fVar288 * auVar15._12_4_;
      fVar292 = fVar292 + fVar292 * auVar15._16_4_;
      fVar296 = fVar296 + fVar296 * auVar15._20_4_;
      fVar300 = fVar300 + fVar300 * auVar15._24_4_;
      auVar306._0_8_ = CONCAT44(fVar152,fVar151) ^ 0x8000000080000000;
      auVar306._8_4_ = -local_b20._8_4_;
      auVar306._12_4_ = -local_b20._12_4_;
      auVar306._16_4_ = -local_b20._16_4_;
      auVar306._20_4_ = -local_b20._20_4_;
      auVar306._24_4_ = -local_b20._24_4_;
      auVar306._28_4_ = -local_b20._28_4_;
      auVar332 = vsubps_avx(auVar306,auVar9);
      fVar151 = auVar332._0_4_ * fVar266;
      fVar152 = auVar332._4_4_ * fVar280;
      auVar32._4_4_ = fVar152;
      auVar32._0_4_ = fVar151;
      fVar315 = auVar332._8_4_ * fVar284;
      auVar32._8_4_ = fVar315;
      fVar318 = auVar332._12_4_ * fVar288;
      auVar32._12_4_ = fVar318;
      fVar321 = auVar332._16_4_ * fVar292;
      auVar32._16_4_ = fVar321;
      fVar324 = auVar332._20_4_ * fVar296;
      auVar32._20_4_ = fVar324;
      fVar327 = auVar332._24_4_ * fVar300;
      auVar32._24_4_ = fVar327;
      auVar32._28_4_ = auVar332._28_4_;
      auVar332 = vsubps_avx(auVar9,local_b20);
      fVar266 = auVar332._0_4_ * fVar266;
      fVar280 = auVar332._4_4_ * fVar280;
      auVar33._4_4_ = fVar280;
      auVar33._0_4_ = fVar266;
      fVar284 = auVar332._8_4_ * fVar284;
      auVar33._8_4_ = fVar284;
      fVar288 = auVar332._12_4_ * fVar288;
      auVar33._12_4_ = fVar288;
      fVar292 = auVar332._16_4_ * fVar292;
      auVar33._16_4_ = fVar292;
      fVar296 = auVar332._20_4_ * fVar296;
      auVar33._20_4_ = fVar296;
      fVar300 = auVar332._24_4_ * fVar300;
      auVar33._24_4_ = fVar300;
      auVar33._28_4_ = auVar332._28_4_;
      fStack_604 = fStack_4a4 + auVar368._28_4_ + auVar15._28_4_;
      local_620[0] = fVar341 * (local_4c0 + fVar293 * fVar151);
      local_620[1] = fVar344 * (fStack_4bc + fVar297 * fVar152);
      local_620[2] = fVar345 * (fStack_4b8 + fVar335 * fVar315);
      local_620[3] = fVar346 * (fStack_4b4 + fVar377 * fVar318);
      fStack_610 = fStack_750 * (fStack_4b0 + fVar114 * fVar321);
      fStack_60c = fStack_74c * (fStack_4ac + fVar115 * fVar324);
      fStack_608 = fStack_748 * (fStack_4a8 + fVar116 * fVar327);
      local_640[0] = fVar341 * (local_4c0 + fVar293 * fVar266);
      local_640[1] = fVar344 * (fStack_4bc + fVar297 * fVar280);
      local_640[2] = fVar345 * (fStack_4b8 + fVar335 * fVar284);
      local_640[3] = fVar346 * (fStack_4b4 + fVar377 * fVar288);
      fStack_630 = fStack_750 * (fStack_4b0 + fVar114 * fVar292);
      fStack_62c = fStack_74c * (fStack_4ac + fVar115 * fVar296);
      fStack_628 = fStack_748 * (fStack_4a8 + fVar116 * fVar300);
      fStack_624 = fStack_4a4 + fStack_604;
      auVar272._8_4_ = 0x7f800000;
      auVar272._0_8_ = 0x7f8000007f800000;
      auVar272._12_4_ = 0x7f800000;
      auVar272._16_4_ = 0x7f800000;
      auVar272._20_4_ = 0x7f800000;
      auVar272._24_4_ = 0x7f800000;
      auVar272._28_4_ = 0x7f800000;
      local_c40 = vblendvps_avx(auVar272,auVar32,auVar16);
      auVar307._8_4_ = 0x7fffffff;
      auVar307._0_8_ = 0x7fffffff7fffffff;
      auVar307._12_4_ = 0x7fffffff;
      auVar307._16_4_ = 0x7fffffff;
      auVar307._20_4_ = 0x7fffffff;
      auVar307._24_4_ = 0x7fffffff;
      auVar307._28_4_ = 0x7fffffff;
      auVar15 = vandps_avx(auVar28,auVar307);
      auVar15 = vmaxps_avx(local_460,auVar15);
      auVar334 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar34._4_4_ = auVar15._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar15._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar15._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar15._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar15._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar15._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar15._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar15._28_4_;
      auVar15 = vandps_avx(auVar13,auVar307);
      auVar15 = vcmpps_avx(auVar15,auVar34,1);
      auVar273._8_4_ = 0xff800000;
      auVar273._0_8_ = 0xff800000ff800000;
      auVar273._12_4_ = 0xff800000;
      auVar273._16_4_ = 0xff800000;
      auVar273._20_4_ = 0xff800000;
      auVar273._24_4_ = 0xff800000;
      auVar273._28_4_ = 0xff800000;
      auVar380 = vblendvps_avx(auVar273,auVar33,auVar16);
      auVar332 = auVar16 & auVar15;
      if ((((((((auVar332 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar332 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar332 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar332 >> 0x7f,0) != '\0') ||
            (auVar332 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar332 >> 0xbf,0) != '\0') ||
          (auVar332 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar332[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar15,auVar16);
        auVar129 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
        auVar59 = ZEXT812(0);
        auVar334 = ZEXT1264(auVar59) << 0x20;
        auVar15 = vcmpps_avx(auVar100,ZEXT1232(auVar59) << 0x20,2);
        auVar343._8_4_ = 0xff800000;
        auVar343._0_8_ = 0xff800000ff800000;
        auVar343._12_4_ = 0xff800000;
        auVar343._16_4_ = 0xff800000;
        auVar343._20_4_ = 0xff800000;
        auVar343._24_4_ = 0xff800000;
        auVar343._28_4_ = 0xff800000;
        auVar370._8_4_ = 0x7f800000;
        auVar370._0_8_ = 0x7f8000007f800000;
        auVar370._12_4_ = 0x7f800000;
        auVar370._16_4_ = 0x7f800000;
        auVar370._20_4_ = 0x7f800000;
        auVar370._24_4_ = 0x7f800000;
        auVar370._28_4_ = 0x7f800000;
        auVar100 = vblendvps_avx(auVar370,auVar343,auVar15);
        auVar303 = vpmovsxwd_avx(auVar129);
        auVar129 = vpunpckhwd_avx(auVar129,auVar129);
        auVar249._16_16_ = auVar129;
        auVar249._0_16_ = auVar303;
        local_c40 = vblendvps_avx(local_c40,auVar100,auVar249);
        auVar100 = vblendvps_avx(auVar343,auVar370,auVar15);
        auVar380 = vblendvps_avx(auVar380,auVar100,auVar249);
        auVar100 = vcmpps_avx(ZEXT1232(auVar59) << 0x20,ZEXT1232(auVar59) << 0x20,0xf);
        auVar175._0_4_ = auVar105._0_4_ ^ auVar100._0_4_;
        auVar175._4_4_ = auVar105._4_4_ ^ auVar100._4_4_;
        auVar175._8_4_ = auVar105._8_4_ ^ auVar100._8_4_;
        auVar175._12_4_ = auVar105._12_4_ ^ auVar100._12_4_;
        auVar175._16_4_ = auVar105._16_4_ ^ auVar100._16_4_;
        auVar175._20_4_ = auVar105._20_4_ ^ auVar100._20_4_;
        auVar175._24_4_ = auVar105._24_4_ ^ auVar100._24_4_;
        auVar175._28_4_ = auVar105._28_4_ ^ auVar100._28_4_;
        auVar105 = vorps_avx(auVar15,auVar175);
        auVar105 = vandps_avx(auVar16,auVar105);
      }
    }
    auVar100 = local_440 & auVar105;
    local_8a0 = local_b20;
    if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0x7f,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar100 >> 0xbf,0) == '\0') &&
        (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar100[0x1f])
    {
LAB_00ecb34e:
      auVar276 = ZEXT3264(local_8a0);
      auVar218._8_4_ = 0x7f800000;
      auVar218._0_8_ = 0x7f8000007f800000;
      auVar218._12_4_ = 0x7f800000;
      auVar218._16_4_ = 0x7f800000;
      auVar218._20_4_ = 0x7f800000;
      auVar218._24_4_ = 0x7f800000;
      auVar218._28_4_ = 0x7f800000;
    }
    else {
      auVar129 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_
                                           )),0);
      auVar134._16_16_ = auVar129;
      auVar134._0_16_ = auVar129;
      auVar16 = vminps_avx(auVar134,auVar380);
      fVar296 = local_440._28_4_;
      auVar102._0_4_ =
           (float)local_b00._0_4_ * fVar264 +
           (float)local_a00._0_4_ * fVar301 + (float)local_980._0_4_ * fVar352;
      auVar102._4_4_ =
           (float)local_b00._4_4_ * fVar278 +
           (float)local_a00._4_4_ * fVar311 + (float)local_980._4_4_ * fVar355;
      auVar102._8_4_ = fStack_af8 * fVar282 + fStack_9f8 * fVar313 + fStack_978 * fVar356;
      auVar102._12_4_ = fStack_af4 * fVar286 + fStack_9f4 * fVar316 + fStack_974 * fVar357;
      auVar102._16_4_ = fStack_af0 * fVar290 + fStack_9f0 * fVar319 + fStack_970 * fVar358;
      auVar102._20_4_ = fStack_aec * fVar294 + fStack_9ec * fVar322 + fStack_96c * fVar359;
      auVar102._24_4_ = fStack_ae8 * fVar298 + fStack_9e8 * fVar325 + fStack_968 * fVar360;
      auVar102._28_4_ = auVar270._28_4_ + fVar296 + auVar369._28_4_;
      auVar100 = vrcpps_avx(auVar102);
      fVar151 = auVar100._0_4_;
      fVar152 = auVar100._4_4_;
      auVar35._4_4_ = auVar102._4_4_ * fVar152;
      auVar35._0_4_ = auVar102._0_4_ * fVar151;
      fVar266 = auVar100._8_4_;
      auVar35._8_4_ = auVar102._8_4_ * fVar266;
      fVar280 = auVar100._12_4_;
      auVar35._12_4_ = auVar102._12_4_ * fVar280;
      fVar284 = auVar100._16_4_;
      auVar35._16_4_ = auVar102._16_4_ * fVar284;
      fVar288 = auVar100._20_4_;
      auVar35._20_4_ = auVar102._20_4_ * fVar288;
      fVar292 = auVar100._24_4_;
      auVar35._24_4_ = auVar102._24_4_ * fVar292;
      auVar35._28_4_ = fVar296;
      auVar339._8_4_ = 0x3f800000;
      auVar339._0_8_ = &DAT_3f8000003f800000;
      auVar339._12_4_ = 0x3f800000;
      auVar339._16_4_ = 0x3f800000;
      auVar339._20_4_ = 0x3f800000;
      auVar339._24_4_ = 0x3f800000;
      auVar339._28_4_ = 0x3f800000;
      auVar332 = vsubps_avx(auVar339,auVar35);
      auVar308._8_4_ = 0x7fffffff;
      auVar308._0_8_ = 0x7fffffff7fffffff;
      auVar308._12_4_ = 0x7fffffff;
      auVar308._16_4_ = 0x7fffffff;
      auVar308._20_4_ = 0x7fffffff;
      auVar308._24_4_ = 0x7fffffff;
      auVar308._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(auVar102,auVar308);
      auVar367._8_4_ = 0x219392ef;
      auVar367._0_8_ = 0x219392ef219392ef;
      auVar367._12_4_ = 0x219392ef;
      auVar367._16_4_ = 0x219392ef;
      auVar367._20_4_ = 0x219392ef;
      auVar367._24_4_ = 0x219392ef;
      auVar367._28_4_ = 0x219392ef;
      auVar15 = vcmpps_avx(auVar100,auVar367,1);
      auVar36._4_4_ =
           (fVar152 + fVar152 * auVar332._4_4_) *
           -(fVar256 * fVar278 + fVar226 * fVar311 + fVar385 * fVar355);
      auVar36._0_4_ =
           (fVar151 + fVar151 * auVar332._0_4_) *
           -(fVar194 * fVar264 + fVar250 * fVar301 + fVar382 * fVar352);
      auVar36._8_4_ =
           (fVar266 + fVar266 * auVar332._8_4_) *
           -(fVar199 * fVar282 + fVar198 * fVar313 + fVar386 * fVar356);
      auVar36._12_4_ =
           (fVar280 + fVar280 * auVar332._12_4_) *
           -(fVar225 * fVar286 + fVar223 * fVar316 + fVar387 * fVar357);
      auVar36._16_4_ =
           (fVar284 + fVar284 * auVar332._16_4_) *
           -(fVar232 * fVar290 + fVar230 * fVar319 + fVar388 * fVar358);
      auVar36._20_4_ =
           (fVar288 + fVar288 * auVar332._20_4_) *
           -(fVar261 * fVar294 + fVar259 * fVar322 + fVar389 * fVar359);
      auVar36._24_4_ =
           (fVar292 + fVar292 * auVar332._24_4_) *
           -(fVar289 * fVar298 + fVar285 * fVar325 + fVar390 * fVar360);
      auVar36._28_4_ = -(auVar369._28_4_ + auVar12._28_4_ + fVar296);
      auVar59 = ZEXT812(0);
      auVar100 = vcmpps_avx(auVar102,ZEXT1232(auVar59) << 0x20,1);
      auVar100 = vorps_avx(auVar15,auVar100);
      auVar333._8_4_ = 0xff800000;
      auVar333._0_8_ = 0xff800000ff800000;
      auVar333._12_4_ = 0xff800000;
      auVar333._16_4_ = 0xff800000;
      auVar333._20_4_ = 0xff800000;
      auVar333._24_4_ = 0xff800000;
      auVar333._28_4_ = 0xff800000;
      auVar334 = ZEXT3264(auVar333);
      auVar100 = vblendvps_avx(auVar36,auVar333,auVar100);
      auVar12 = vcmpps_avx(auVar102,ZEXT1232(auVar59) << 0x20,6);
      auVar12 = vorps_avx(auVar15,auVar12);
      auVar218._8_4_ = 0x7f800000;
      auVar218._0_8_ = 0x7f8000007f800000;
      auVar218._12_4_ = 0x7f800000;
      auVar218._16_4_ = 0x7f800000;
      auVar218._20_4_ = 0x7f800000;
      auVar218._24_4_ = 0x7f800000;
      auVar218._28_4_ = 0x7f800000;
      auVar12 = vblendvps_avx(auVar36,auVar218,auVar12);
      auVar369 = vmaxps_avx(local_3a0,local_c40);
      auVar369 = vmaxps_avx(auVar369,auVar100);
      auVar12 = vminps_avx(auVar16,auVar12);
      auVar368 = ZEXT1232(auVar59) << 0x20;
      auVar100 = vsubps_avx(auVar368,local_ac0);
      auVar15 = vsubps_avx(auVar368,_local_ae0);
      auVar37._4_4_ = auVar15._4_4_ * -fVar371;
      auVar37._0_4_ = auVar15._0_4_ * -fVar361;
      auVar37._8_4_ = auVar15._8_4_ * -fVar372;
      auVar37._12_4_ = auVar15._12_4_ * -fVar373;
      auVar37._16_4_ = auVar15._16_4_ * -fVar374;
      auVar37._20_4_ = auVar15._20_4_ * -fVar375;
      auVar37._24_4_ = auVar15._24_4_ * -fVar376;
      auVar37._28_4_ = auVar15._28_4_;
      auVar38._4_4_ = fVar312 * auVar100._4_4_;
      auVar38._0_4_ = fVar302 * auVar100._0_4_;
      auVar38._8_4_ = fVar314 * auVar100._8_4_;
      auVar38._12_4_ = fVar317 * auVar100._12_4_;
      auVar38._16_4_ = fVar320 * auVar100._16_4_;
      auVar38._20_4_ = fVar323 * auVar100._20_4_;
      auVar38._24_4_ = fVar326 * auVar100._24_4_;
      auVar38._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(auVar37,auVar38);
      auVar11 = vsubps_avx(auVar368,auVar11);
      auVar39._4_4_ = fVar279 * auVar11._4_4_;
      auVar39._0_4_ = fVar265 * auVar11._0_4_;
      auVar39._8_4_ = fVar283 * auVar11._8_4_;
      auVar39._12_4_ = fVar287 * auVar11._12_4_;
      auVar39._16_4_ = fVar291 * auVar11._16_4_;
      auVar39._20_4_ = fVar295 * auVar11._20_4_;
      uVar1 = auVar11._28_4_;
      auVar39._24_4_ = fVar299 * auVar11._24_4_;
      auVar39._28_4_ = uVar1;
      auVar15 = vsubps_avx(auVar100,auVar39);
      auVar40._4_4_ = (float)local_980._4_4_ * -fVar371;
      auVar40._0_4_ = (float)local_980._0_4_ * -fVar361;
      auVar40._8_4_ = fStack_978 * -fVar372;
      auVar40._12_4_ = fStack_974 * -fVar373;
      auVar40._16_4_ = fStack_970 * -fVar374;
      auVar40._20_4_ = fStack_96c * -fVar375;
      auVar40._24_4_ = fStack_968 * -fVar376;
      auVar40._28_4_ = uVar82 ^ 0x80000000;
      auVar41._4_4_ = (float)local_a00._4_4_ * fVar312;
      auVar41._0_4_ = (float)local_a00._0_4_ * fVar302;
      auVar41._8_4_ = fStack_9f8 * fVar314;
      auVar41._12_4_ = fStack_9f4 * fVar317;
      auVar41._16_4_ = fStack_9f0 * fVar320;
      auVar41._20_4_ = fStack_9ec * fVar323;
      auVar41._24_4_ = fStack_9e8 * fVar326;
      auVar41._28_4_ = uVar1;
      auVar340._8_4_ = 0x3f800000;
      auVar340._0_8_ = &DAT_3f8000003f800000;
      auVar340._12_4_ = 0x3f800000;
      auVar340._16_4_ = 0x3f800000;
      auVar340._20_4_ = 0x3f800000;
      auVar340._24_4_ = 0x3f800000;
      auVar340._28_4_ = 0x3f800000;
      auVar100 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = (float)local_b00._4_4_ * fVar279;
      auVar42._0_4_ = (float)local_b00._0_4_ * fVar265;
      auVar42._8_4_ = fStack_af8 * fVar283;
      auVar42._12_4_ = fStack_af4 * fVar287;
      auVar42._16_4_ = fStack_af0 * fVar291;
      auVar42._20_4_ = fStack_aec * fVar295;
      auVar42._24_4_ = fStack_ae8 * fVar299;
      auVar42._28_4_ = uVar1;
      auVar16 = vsubps_avx(auVar100,auVar42);
      auVar100 = vrcpps_avx(auVar16);
      fVar250 = auVar100._0_4_;
      fVar194 = auVar100._4_4_;
      auVar43._4_4_ = auVar16._4_4_ * fVar194;
      auVar43._0_4_ = auVar16._0_4_ * fVar250;
      fVar226 = auVar100._8_4_;
      auVar43._8_4_ = auVar16._8_4_ * fVar226;
      fVar256 = auVar100._12_4_;
      auVar43._12_4_ = auVar16._12_4_ * fVar256;
      fVar198 = auVar100._16_4_;
      auVar43._16_4_ = auVar16._16_4_ * fVar198;
      fVar199 = auVar100._20_4_;
      auVar43._20_4_ = auVar16._20_4_ * fVar199;
      fVar223 = auVar100._24_4_;
      auVar43._24_4_ = auVar16._24_4_ * fVar223;
      auVar43._28_4_ = fStack_ae4;
      auVar332 = vsubps_avx(auVar340,auVar43);
      auVar100 = vandps_avx(auVar16,auVar308);
      auVar168._8_4_ = 0x219392ef;
      auVar168._0_8_ = 0x219392ef219392ef;
      auVar168._12_4_ = 0x219392ef;
      auVar168._16_4_ = 0x219392ef;
      auVar168._20_4_ = 0x219392ef;
      auVar168._24_4_ = 0x219392ef;
      auVar168._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar100,auVar168,1);
      auVar276 = ZEXT3264(auVar11);
      auVar44._4_4_ = (fVar194 + fVar194 * auVar332._4_4_) * -auVar15._4_4_;
      auVar44._0_4_ = (fVar250 + fVar250 * auVar332._0_4_) * -auVar15._0_4_;
      auVar44._8_4_ = (fVar226 + fVar226 * auVar332._8_4_) * -auVar15._8_4_;
      auVar44._12_4_ = (fVar256 + fVar256 * auVar332._12_4_) * -auVar15._12_4_;
      auVar44._16_4_ = (fVar198 + fVar198 * auVar332._16_4_) * -auVar15._16_4_;
      auVar44._20_4_ = (fVar199 + fVar199 * auVar332._20_4_) * -auVar15._20_4_;
      auVar44._24_4_ = (fVar223 + fVar223 * auVar332._24_4_) * -auVar15._24_4_;
      auVar44._28_4_ = auVar15._28_4_ ^ 0x80000000;
      auVar100 = vcmpps_avx(auVar16,auVar368,1);
      auVar100 = vorps_avx(auVar11,auVar100);
      auVar100 = vblendvps_avx(auVar44,auVar333,auVar100);
      local_8a0 = vmaxps_avx(auVar369,auVar100);
      auVar369 = ZEXT1232(auVar59) << 0x20;
      auVar100 = vcmpps_avx(auVar16,auVar369,6);
      auVar100 = vorps_avx(auVar11,auVar100);
      auVar100 = vblendvps_avx(auVar44,auVar218,auVar100);
      auVar105 = vandps_avx(auVar105,local_440);
      local_3c0 = vminps_avx(auVar12,auVar100);
      auVar100 = vcmpps_avx(local_8a0,local_3c0,2);
      auVar11 = auVar105 & auVar100;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar11 = vminps_avx(local_7c0,auVar133);
        auVar12 = vminps_avx(local_7e0,local_800);
        auVar11 = vminps_avx(auVar11,auVar12);
        auVar10 = vsubps_avx(auVar11,auVar10);
        auVar105 = vandps_avx(auVar100,auVar105);
        auVar76._4_4_ = local_620[1];
        auVar76._0_4_ = local_620[0];
        auVar76._8_4_ = local_620[2];
        auVar76._12_4_ = local_620[3];
        auVar76._16_4_ = fStack_610;
        auVar76._20_4_ = fStack_60c;
        auVar76._24_4_ = fStack_608;
        auVar76._28_4_ = fStack_604;
        auVar100 = vminps_avx(auVar76,auVar340);
        auVar100 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
        local_620[0] = fVar233 + fVar258 * (auVar100._0_4_ + 0.0) * 0.125;
        local_620[1] = fVar252 + fVar260 * (auVar100._4_4_ + 1.0) * 0.125;
        local_620[2] = fVar255 + fVar263 * (auVar100._8_4_ + 2.0) * 0.125;
        local_620[3] = fVar113 + fVar153 * (auVar100._12_4_ + 3.0) * 0.125;
        fStack_610 = fVar233 + fVar258 * (auVar100._16_4_ + 4.0) * 0.125;
        fStack_60c = fVar252 + fVar260 * (auVar100._20_4_ + 5.0) * 0.125;
        fStack_608 = fVar255 + fVar263 * (auVar100._24_4_ + 6.0) * 0.125;
        fStack_604 = fVar113 + auVar100._28_4_ + 7.0;
        auVar75._4_4_ = local_640[1];
        auVar75._0_4_ = local_640[0];
        auVar75._8_4_ = local_640[2];
        auVar75._12_4_ = local_640[3];
        auVar75._16_4_ = fStack_630;
        auVar75._20_4_ = fStack_62c;
        auVar75._24_4_ = fStack_628;
        auVar75._28_4_ = fStack_624;
        auVar100 = vminps_avx(auVar75,auVar340);
        auVar100 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
        local_640[0] = fVar233 + fVar258 * (auVar100._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar252 + fVar260 * (auVar100._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar255 + fVar263 * (auVar100._8_4_ + 2.0) * 0.125;
        local_640[3] = fVar113 + fVar153 * (auVar100._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar233 + fVar258 * (auVar100._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar252 + fVar260 * (auVar100._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar255 + fVar263 * (auVar100._24_4_ + 6.0) * 0.125;
        fStack_624 = fVar113 + auVar100._28_4_ + 7.0;
        auVar46._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar46._28_4_ = 0x3f7ffffc;
        auVar100 = vmaxps_avx(auVar369,auVar46);
        auVar47._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar47._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar47._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar47._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar47._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar47._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar47._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar47._28_4_ = auVar100._28_4_;
        auVar10 = vsubps_avx(auVar14,auVar47);
        auVar48._4_4_ = auVar10._4_4_ * fVar155 * 4.0;
        auVar48._0_4_ = auVar10._0_4_ * fVar154 * 4.0;
        auVar48._8_4_ = auVar10._8_4_ * fVar156 * 4.0;
        auVar48._12_4_ = auVar10._12_4_ * fVar157 * 4.0;
        auVar48._16_4_ = auVar10._16_4_ * fVar349 * 4.0;
        auVar48._20_4_ = auVar10._20_4_ * fVar350 * 4.0;
        auVar48._24_4_ = auVar10._24_4_ * fVar351 * 4.0;
        auVar48._28_4_ = auVar100._28_4_;
        auVar11 = vsubps_avx(auVar29,auVar48);
        local_940 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
        auVar100 = local_940;
        if ((((((((local_940 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_940 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_940 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_940 >> 0x7f,0) == '\0') &&
              (local_940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_940 >> 0xbf,0) == '\0') &&
            (local_940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_940[0x1f]) {
          _local_8e0 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_880 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar186 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar216 = ZEXT828(0) << 0x20;
          auVar337 = ZEXT828(0) << 0x20;
          auVar135._8_4_ = 0x7f800000;
          auVar135._0_8_ = 0x7f8000007f800000;
          auVar135._12_4_ = 0x7f800000;
          auVar135._16_4_ = 0x7f800000;
          auVar135._20_4_ = 0x7f800000;
          auVar135._24_4_ = 0x7f800000;
          auVar135._28_4_ = 0x7f800000;
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          local_940 = auVar17;
          _local_8c0 = _local_8e0;
        }
        else {
          auVar14 = vsqrtps_avx(auVar11);
          auVar136._0_4_ = fVar154 + fVar154;
          auVar136._4_4_ = fVar155 + fVar155;
          auVar136._8_4_ = fVar156 + fVar156;
          auVar136._12_4_ = fVar157 + fVar157;
          auVar136._16_4_ = fVar349 + fVar349;
          auVar136._20_4_ = fVar350 + fVar350;
          auVar136._24_4_ = fVar351 + fVar351;
          auVar136._28_4_ = fVar202 + fVar202;
          auVar12 = vrcpps_avx(auVar136);
          fVar202 = auVar12._0_4_;
          fVar250 = auVar12._4_4_;
          auVar49._4_4_ = auVar136._4_4_ * fVar250;
          auVar49._0_4_ = auVar136._0_4_ * fVar202;
          fVar194 = auVar12._8_4_;
          auVar49._8_4_ = auVar136._8_4_ * fVar194;
          fVar226 = auVar12._12_4_;
          auVar49._12_4_ = auVar136._12_4_ * fVar226;
          fVar256 = auVar12._16_4_;
          auVar49._16_4_ = auVar136._16_4_ * fVar256;
          fVar198 = auVar12._20_4_;
          auVar49._20_4_ = auVar136._20_4_ * fVar198;
          fVar199 = auVar12._24_4_;
          auVar49._24_4_ = auVar136._24_4_ * fVar199;
          auVar49._28_4_ = auVar136._28_4_;
          auVar15 = vsubps_avx(auVar340,auVar49);
          fVar202 = fVar202 + fVar202 * auVar15._0_4_;
          fVar250 = fVar250 + fVar250 * auVar15._4_4_;
          fVar194 = fVar194 + fVar194 * auVar15._8_4_;
          fVar226 = fVar226 + fVar226 * auVar15._12_4_;
          fVar256 = fVar256 + fVar256 * auVar15._16_4_;
          fVar198 = fVar198 + fVar198 * auVar15._20_4_;
          fVar199 = fVar199 + fVar199 * auVar15._24_4_;
          fVar289 = auVar12._28_4_ + auVar15._28_4_;
          auVar137._0_8_ = local_b20._0_8_ ^ 0x8000000080000000;
          auVar137._8_4_ = -local_b20._8_4_;
          auVar137._12_4_ = -local_b20._12_4_;
          auVar137._16_4_ = -local_b20._16_4_;
          auVar137._20_4_ = -local_b20._20_4_;
          auVar137._24_4_ = -local_b20._24_4_;
          auVar137._28_4_ = -local_b20._28_4_;
          auVar12 = vsubps_avx(auVar137,auVar14);
          fVar223 = auVar12._0_4_ * fVar202;
          fVar225 = auVar12._4_4_ * fVar250;
          auVar50._4_4_ = fVar225;
          auVar50._0_4_ = fVar223;
          fVar230 = auVar12._8_4_ * fVar194;
          auVar50._8_4_ = fVar230;
          fVar232 = auVar12._12_4_ * fVar226;
          auVar50._12_4_ = fVar232;
          fVar259 = auVar12._16_4_ * fVar256;
          auVar50._16_4_ = fVar259;
          fVar261 = auVar12._20_4_ * fVar198;
          auVar50._20_4_ = fVar261;
          fVar285 = auVar12._24_4_ * fVar199;
          auVar50._24_4_ = fVar285;
          auVar50._28_4_ = auVar12._28_4_;
          auVar12 = vsubps_avx(auVar14,local_b20);
          fVar202 = auVar12._0_4_ * fVar202;
          fVar250 = auVar12._4_4_ * fVar250;
          auVar51._4_4_ = fVar250;
          auVar51._0_4_ = fVar202;
          fVar194 = auVar12._8_4_ * fVar194;
          auVar51._8_4_ = fVar194;
          fVar226 = auVar12._12_4_ * fVar226;
          auVar51._12_4_ = fVar226;
          fVar256 = auVar12._16_4_ * fVar256;
          auVar51._16_4_ = fVar256;
          fVar198 = auVar12._20_4_ * fVar198;
          auVar51._20_4_ = fVar198;
          fVar199 = auVar12._24_4_ * fVar199;
          auVar51._24_4_ = fVar199;
          auVar51._28_4_ = local_b20._28_4_;
          fVar233 = (fVar223 * fVar293 + local_4c0) * fVar341;
          fVar252 = (fVar225 * fVar297 + fStack_4bc) * fVar344;
          fVar255 = (fVar230 * fVar335 + fStack_4b8) * fVar345;
          fVar258 = (fVar232 * fVar377 + fStack_4b4) * fVar346;
          fVar260 = (fVar259 * fVar114 + fStack_4b0) * fStack_750;
          fVar151 = (fVar261 * fVar115 + fStack_4ac) * fStack_74c;
          fVar263 = (fVar285 * fVar116 + fStack_4a8) * fStack_748;
          auVar190._0_4_ = auVar364._0_4_ + fVar222 * fVar233;
          auVar190._4_4_ = auVar364._4_4_ + fVar196 * fVar252;
          auVar190._8_4_ = auVar364._8_4_ + fVar197 * fVar255;
          auVar190._12_4_ = auVar364._12_4_ + fVar203 * fVar258;
          auVar190._16_4_ = auVar364._16_4_ + fVar229 * fVar260;
          auVar190._20_4_ = auVar364._20_4_ + fVar257 * fVar151;
          auVar190._24_4_ = auVar364._24_4_ + fVar281 * fVar263;
          auVar190._28_4_ = auVar364._28_4_ + auVar12._28_4_ + fStack_4a4;
          auVar52._4_4_ = (float)local_b00._4_4_ * fVar225;
          auVar52._0_4_ = (float)local_b00._0_4_ * fVar223;
          auVar52._8_4_ = fStack_af8 * fVar230;
          auVar52._12_4_ = fStack_af4 * fVar232;
          auVar52._16_4_ = fStack_af0 * fVar259;
          auVar52._20_4_ = fStack_aec * fVar261;
          auVar52._24_4_ = fStack_ae8 * fVar285;
          auVar52._28_4_ = fVar289;
          local_ac0 = vsubps_avx(auVar52,auVar190);
          auVar219._0_4_ = auVar379._0_4_ + fVar231 * fVar233;
          auVar219._4_4_ = auVar379._4_4_ + fVar224 * fVar252;
          auVar219._8_4_ = auVar379._8_4_ + fVar193 * fVar255;
          auVar219._12_4_ = auVar379._12_4_ + fVar200 * fVar258;
          auVar219._16_4_ = auVar379._16_4_ + fVar227 * fVar260;
          auVar219._20_4_ = auVar379._20_4_ + fVar251 * fVar151;
          auVar219._24_4_ = auVar379._24_4_ + fVar262 * fVar263;
          auVar219._28_4_ = auVar379._28_4_ + fVar289;
          auVar53._4_4_ = (float)local_a00._4_4_ * fVar225;
          auVar53._0_4_ = (float)local_a00._0_4_ * fVar223;
          auVar53._8_4_ = fStack_9f8 * fVar230;
          auVar53._12_4_ = fStack_9f4 * fVar232;
          auVar53._16_4_ = fStack_9f0 * fVar259;
          auVar53._20_4_ = fStack_9ec * fVar261;
          auVar53._24_4_ = fStack_9e8 * fVar285;
          auVar53._28_4_ = fVar113;
          _local_ae0 = vsubps_avx(auVar53,auVar219);
          auVar244._0_4_ = auVar383._0_4_ + fVar192 * fVar233;
          auVar244._4_4_ = auVar383._4_4_ + fVar253 * fVar252;
          auVar244._8_4_ = auVar383._8_4_ + fVar195 * fVar255;
          auVar244._12_4_ = auVar383._12_4_ + fVar201 * fVar258;
          auVar244._16_4_ = auVar383._16_4_ + fVar228 * fVar260;
          auVar244._20_4_ = auVar383._20_4_ + fVar254 * fVar151;
          auVar244._24_4_ = auVar383._24_4_ + fVar277 * fVar263;
          auVar244._28_4_ = auVar383._28_4_ + 0.0;
          auVar54._4_4_ = (float)local_980._4_4_ * fVar225;
          auVar54._0_4_ = (float)local_980._0_4_ * fVar223;
          auVar54._8_4_ = fStack_978 * fVar230;
          auVar54._12_4_ = fStack_974 * fVar232;
          auVar54._16_4_ = fStack_970 * fVar259;
          auVar54._20_4_ = fStack_96c * fVar261;
          auVar54._24_4_ = fStack_968 * fVar285;
          auVar54._28_4_ = fVar113;
          auVar14 = vsubps_avx(auVar54,auVar244);
          fVar341 = (fVar202 * fVar293 + local_4c0) * fVar341;
          fVar344 = (fVar250 * fVar297 + fStack_4bc) * fVar344;
          fVar345 = (fVar194 * fVar335 + fStack_4b8) * fVar345;
          fVar346 = (fVar226 * fVar377 + fStack_4b4) * fVar346;
          fVar223 = (fVar256 * fVar114 + fStack_4b0) * fStack_750;
          fVar225 = (fVar198 * fVar115 + fStack_4ac) * fStack_74c;
          fVar230 = (fVar199 * fVar116 + fStack_4a8) * fStack_748;
          auVar274._0_4_ = auVar364._0_4_ + fVar222 * fVar341;
          auVar274._4_4_ = auVar364._4_4_ + fVar196 * fVar344;
          auVar274._8_4_ = auVar364._8_4_ + fVar197 * fVar345;
          auVar274._12_4_ = auVar364._12_4_ + fVar203 * fVar346;
          auVar274._16_4_ = auVar364._16_4_ + fVar229 * fVar223;
          auVar274._20_4_ = auVar364._20_4_ + fVar257 * fVar225;
          auVar274._24_4_ = auVar364._24_4_ + fVar281 * fVar230;
          auVar274._28_4_ = auVar364._28_4_ + fVar113;
          auVar55._4_4_ = (float)local_b00._4_4_ * fVar250;
          auVar55._0_4_ = (float)local_b00._0_4_ * fVar202;
          auVar55._8_4_ = fStack_af8 * fVar194;
          auVar55._12_4_ = fStack_af4 * fVar226;
          auVar55._16_4_ = fStack_af0 * fVar256;
          auVar55._20_4_ = fStack_aec * fVar198;
          auVar55._24_4_ = fStack_ae8 * fVar199;
          auVar55._28_4_ = fStack_ae4;
          _local_8c0 = vsubps_avx(auVar55,auVar274);
          auVar275._0_4_ = auVar379._0_4_ + fVar231 * fVar341;
          auVar275._4_4_ = auVar379._4_4_ + fVar224 * fVar344;
          auVar275._8_4_ = auVar379._8_4_ + fVar193 * fVar345;
          auVar275._12_4_ = auVar379._12_4_ + fVar200 * fVar346;
          auVar275._16_4_ = auVar379._16_4_ + fVar227 * fVar223;
          auVar275._20_4_ = auVar379._20_4_ + fVar251 * fVar225;
          auVar275._24_4_ = auVar379._24_4_ + fVar262 * fVar230;
          auVar275._28_4_ = auVar379._28_4_ + local_8c0._28_4_;
          auVar56._4_4_ = (float)local_a00._4_4_ * fVar250;
          auVar56._0_4_ = (float)local_a00._0_4_ * fVar202;
          auVar56._8_4_ = fStack_9f8 * fVar194;
          auVar56._12_4_ = fStack_9f4 * fVar226;
          auVar56._16_4_ = fStack_9f0 * fVar256;
          auVar56._20_4_ = fStack_9ec * fVar198;
          auVar56._24_4_ = fStack_9e8 * fVar199;
          auVar56._28_4_ = fStack_ae4;
          _local_8e0 = vsubps_avx(auVar56,auVar275);
          auVar245._0_4_ = auVar383._0_4_ + fVar192 * fVar341;
          auVar245._4_4_ = auVar383._4_4_ + fVar253 * fVar344;
          auVar245._8_4_ = auVar383._8_4_ + fVar195 * fVar345;
          auVar245._12_4_ = auVar383._12_4_ + fVar201 * fVar346;
          auVar245._16_4_ = auVar383._16_4_ + fVar228 * fVar223;
          auVar245._20_4_ = auVar383._20_4_ + fVar254 * fVar225;
          auVar245._24_4_ = auVar383._24_4_ + fVar277 * fVar230;
          auVar245._28_4_ = auVar383._28_4_ + auVar14._28_4_ + fStack_4a4;
          auVar57._4_4_ = (float)local_980._4_4_ * fVar250;
          auVar57._0_4_ = (float)local_980._0_4_ * fVar202;
          auVar57._8_4_ = fStack_978 * fVar194;
          auVar57._12_4_ = fStack_974 * fVar226;
          auVar57._16_4_ = fStack_970 * fVar256;
          auVar57._20_4_ = fStack_96c * fVar198;
          auVar57._24_4_ = fStack_968 * fVar199;
          auVar57._28_4_ = local_8e0._28_4_;
          _local_880 = vsubps_avx(auVar57,auVar245);
          auVar12 = vcmpps_avx(auVar11,auVar369,5);
          auVar246._8_4_ = 0x7f800000;
          auVar246._0_8_ = 0x7f8000007f800000;
          auVar246._12_4_ = 0x7f800000;
          auVar246._16_4_ = 0x7f800000;
          auVar246._20_4_ = 0x7f800000;
          auVar246._24_4_ = 0x7f800000;
          auVar246._28_4_ = 0x7f800000;
          auVar135 = vblendvps_avx(auVar246,auVar50,auVar12);
          auVar309._8_4_ = 0x7fffffff;
          auVar309._0_8_ = 0x7fffffff7fffffff;
          auVar309._12_4_ = 0x7fffffff;
          auVar309._16_4_ = 0x7fffffff;
          auVar309._20_4_ = 0x7fffffff;
          auVar309._24_4_ = 0x7fffffff;
          auVar309._28_4_ = 0x7fffffff;
          auVar11 = vandps_avx(auVar309,auVar28);
          auVar11 = vmaxps_avx(local_460,auVar11);
          auVar58._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar58._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar58._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar58._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar58._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar58._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar58._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar58._28_4_ = auVar11._28_4_;
          auVar11 = vandps_avx(auVar309,auVar13);
          auVar11 = vcmpps_avx(auVar11,auVar58,1);
          auVar247._8_4_ = 0xff800000;
          auVar247._0_8_ = 0xff800000ff800000;
          auVar247._12_4_ = 0xff800000;
          auVar247._16_4_ = 0xff800000;
          auVar247._20_4_ = 0xff800000;
          auVar247._24_4_ = 0xff800000;
          auVar247._28_4_ = 0xff800000;
          auVar243 = vblendvps_avx(auVar247,auVar51,auVar12);
          auVar13 = auVar12 & auVar11;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar100 = vandps_avx(auVar11,auVar12);
            auVar129 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            auVar11 = vcmpps_avx(auVar10,auVar369,2);
            auVar381._8_4_ = 0xff800000;
            auVar381._0_8_ = 0xff800000ff800000;
            auVar381._12_4_ = 0xff800000;
            auVar381._16_4_ = 0xff800000;
            auVar381._20_4_ = 0xff800000;
            auVar381._24_4_ = 0xff800000;
            auVar381._28_4_ = 0xff800000;
            auVar384._8_4_ = 0x7f800000;
            auVar384._0_8_ = 0x7f8000007f800000;
            auVar384._12_4_ = 0x7f800000;
            auVar384._16_4_ = 0x7f800000;
            auVar384._20_4_ = 0x7f800000;
            auVar384._24_4_ = 0x7f800000;
            auVar384._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar384,auVar381,auVar11);
            auVar303 = vpmovsxwd_avx(auVar129);
            auVar129 = vpunpckhwd_avx(auVar129,auVar129);
            auVar310._16_16_ = auVar129;
            auVar310._0_16_ = auVar303;
            auVar135 = vblendvps_avx(auVar135,auVar10,auVar310);
            auVar10 = vblendvps_avx(auVar381,auVar384,auVar11);
            auVar243 = vblendvps_avx(auVar243,auVar10,auVar310);
            auVar10 = vcmpps_avx(auVar369,auVar369,0xf);
            auVar176._0_4_ = auVar100._0_4_ ^ auVar10._0_4_;
            auVar176._4_4_ = auVar100._4_4_ ^ auVar10._4_4_;
            auVar176._8_4_ = auVar100._8_4_ ^ auVar10._8_4_;
            auVar176._12_4_ = auVar100._12_4_ ^ auVar10._12_4_;
            auVar176._16_4_ = auVar100._16_4_ ^ auVar10._16_4_;
            auVar176._20_4_ = auVar100._20_4_ ^ auVar10._20_4_;
            auVar176._24_4_ = auVar100._24_4_ ^ auVar10._24_4_;
            auVar176._28_4_ = auVar100._28_4_ ^ auVar10._28_4_;
            auVar100 = vorps_avx(auVar11,auVar176);
            auVar100 = vandps_avx(auVar12,auVar100);
          }
          auVar186 = local_ac0._0_28_;
          auVar216 = local_ae0._0_28_;
          auVar337 = auVar14._0_28_;
        }
        auVar334 = ZEXT3264(auVar105);
        _local_420 = local_8a0;
        local_400 = vminps_avx(local_3c0,auVar135);
        _local_6a0 = vmaxps_avx(local_8a0,auVar243);
        _local_3e0 = _local_6a0;
        auVar10 = vcmpps_avx(local_8a0,local_400,2);
        local_660 = vandps_avx(auVar105,auVar10);
        auVar10 = vcmpps_avx(_local_6a0,local_3c0,2);
        local_840 = vandps_avx(auVar105,auVar10);
        auVar105 = vorps_avx(local_840,local_660);
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0x7f,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0xbf,0) == '\0') &&
            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar105[0x1f]) goto LAB_00ecb34e;
        local_a40 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_6e0._0_4_ = auVar100._0_4_ ^ local_a40._0_4_;
        local_6e0._4_4_ = auVar100._4_4_ ^ local_a40._4_4_;
        local_6e0._8_4_ = auVar100._8_4_ ^ local_a40._8_4_;
        local_6e0._12_4_ = auVar100._12_4_ ^ local_a40._12_4_;
        local_6e0._16_4_ = auVar100._16_4_ ^ local_a40._16_4_;
        local_6e0._20_4_ = auVar100._20_4_ ^ local_a40._20_4_;
        local_6e0._24_4_ = auVar100._24_4_ ^ local_a40._24_4_;
        local_6e0._28_4_ = (uint)auVar100._28_4_ ^ (uint)local_a40._28_4_;
        auVar334 = ZEXT3264(local_6e0);
        auVar276 = ZEXT3264(local_660);
        auVar104._0_4_ =
             (float)local_b00._0_4_ * auVar186._0_4_ +
             (float)local_a00._0_4_ * auVar216._0_4_ + (float)local_980._0_4_ * auVar337._0_4_;
        auVar104._4_4_ =
             (float)local_b00._4_4_ * auVar186._4_4_ +
             (float)local_a00._4_4_ * auVar216._4_4_ + (float)local_980._4_4_ * auVar337._4_4_;
        auVar104._8_4_ =
             fStack_af8 * auVar186._8_4_ + fStack_9f8 * auVar216._8_4_ + fStack_978 * auVar337._8_4_
        ;
        auVar104._12_4_ =
             fStack_af4 * auVar186._12_4_ +
             fStack_9f4 * auVar216._12_4_ + fStack_974 * auVar337._12_4_;
        auVar104._16_4_ =
             fStack_af0 * auVar186._16_4_ +
             fStack_9f0 * auVar216._16_4_ + fStack_970 * auVar337._16_4_;
        auVar104._20_4_ =
             fStack_aec * auVar186._20_4_ +
             fStack_9ec * auVar216._20_4_ + fStack_96c * auVar337._20_4_;
        auVar104._24_4_ =
             fStack_ae8 * auVar186._24_4_ +
             fStack_9e8 * auVar216._24_4_ + fStack_968 * auVar337._24_4_;
        auVar104._28_4_ = local_a40._28_4_ + fStack_ae4 + auVar100._28_4_;
        auVar138._8_4_ = 0x7fffffff;
        auVar138._0_8_ = 0x7fffffff7fffffff;
        auVar138._12_4_ = 0x7fffffff;
        auVar138._16_4_ = 0x7fffffff;
        auVar138._20_4_ = 0x7fffffff;
        auVar138._24_4_ = 0x7fffffff;
        auVar138._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar104,auVar138);
        auVar139._8_4_ = 0x3e99999a;
        auVar139._0_8_ = 0x3e99999a3e99999a;
        auVar139._12_4_ = 0x3e99999a;
        auVar139._16_4_ = 0x3e99999a;
        auVar139._20_4_ = 0x3e99999a;
        auVar139._24_4_ = 0x3e99999a;
        auVar139._28_4_ = 0x3e99999a;
        auVar105 = vcmpps_avx(auVar105,auVar139,1);
        auVar105 = vorps_avx(local_6e0,auVar105);
        auVar140._8_4_ = 3;
        auVar140._0_8_ = 0x300000003;
        auVar140._12_4_ = 3;
        auVar140._16_4_ = 3;
        auVar140._20_4_ = 3;
        auVar140._24_4_ = 3;
        auVar140._28_4_ = 3;
        auVar169._8_4_ = 2;
        auVar169._0_8_ = 0x200000002;
        auVar169._12_4_ = 2;
        auVar169._16_4_ = 2;
        auVar169._20_4_ = 2;
        auVar169._24_4_ = 2;
        auVar169._28_4_ = 2;
        auVar105 = vblendvps_avx(auVar169,auVar140,auVar105);
        local_6c0 = ZEXT432((uint)uVar81);
        local_760 = vpshufd_avx(ZEXT416((uint)uVar81),0);
        auVar129 = vpcmpgtd_avx(auVar105._16_16_,local_760);
        auVar303 = vpcmpgtd_avx(auVar105._0_16_,local_760);
        auVar141._16_16_ = auVar129;
        auVar141._0_16_ = auVar303;
        auVar105 = vblendps_avx(ZEXT1632(auVar303),auVar141,0xf0);
        local_700 = vandnps_avx(auVar105,local_660);
        auVar191 = ZEXT3264(local_700);
        auVar100 = local_660 & ~auVar105;
        auStack_738 = auVar133._8_24_;
        local_740 = uVar81;
        local_680 = auVar105;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0x7f,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0xbf,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar100[0x1f]) {
          auVar221 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          fVar222 = (float)local_980._0_4_;
          fVar250 = (float)local_980._4_4_;
          fVar224 = fStack_978;
          fVar253 = fStack_974;
          fVar196 = fStack_970;
          fVar226 = fStack_96c;
          fVar256 = fStack_968;
          fVar203 = (float)local_b00._0_4_;
          fVar223 = (float)local_b00._4_4_;
          fVar225 = fStack_af8;
          fVar227 = fStack_af4;
          fVar228 = fStack_af0;
          fVar229 = fStack_aec;
          fVar230 = fStack_ae8;
          fVar193 = (float)local_a00._0_4_;
          fVar195 = (float)local_a00._4_4_;
          fVar197 = fStack_9f8;
          fVar198 = fStack_9f4;
          fVar199 = fStack_9f0;
          fVar200 = fStack_9ec;
          fVar201 = fStack_9e8;
        }
        else {
          local_860._4_4_ = local_8a0._4_4_ + fStack_9dc;
          local_860._0_4_ = local_8a0._0_4_ + local_9e0;
          fStack_858 = local_8a0._8_4_ + fStack_9d8;
          fStack_854 = local_8a0._12_4_ + fStack_9d4;
          fStack_850 = local_8a0._16_4_ + fStack_9d0;
          fStack_84c = local_8a0._20_4_ + fStack_9cc;
          fStack_848 = local_8a0._24_4_ + fStack_9c8;
          fStack_844 = local_8a0._28_4_ + fStack_9c4;
          auVar221 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_720 = local_840;
          do {
            auVar208 = auVar221._0_16_;
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar105 = auVar191._0_32_;
            auVar100 = vblendvps_avx(auVar142,local_8a0,auVar105);
            auVar10 = vshufps_avx(auVar100,auVar100,0xb1);
            auVar10 = vminps_avx(auVar100,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vperm2f128_avx(auVar10,auVar10,1);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar100 = vcmpps_avx(auVar100,auVar10,0);
            auVar10 = auVar105 & auVar100;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar105 = vandps_avx(auVar100,auVar105);
            }
            local_800._0_8_ = uVar85;
            uVar77 = vmovmskps_avx(auVar105);
            uVar82 = 0;
            if (uVar77 != 0) {
              for (; (uVar77 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
              }
            }
            uVar81 = (ulong)uVar82;
            *(undefined4 *)(local_700 + uVar81 * 4) = 0;
            fVar202 = local_620[uVar81];
            uVar82 = *(uint *)(local_420 + uVar81 * 4);
            fVar231 = auVar120._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar231 = sqrtf((float)local_9c0._0_4_);
              auVar208._8_4_ = 0x7fffffff;
              auVar208._0_8_ = 0x7fffffff7fffffff;
              auVar208._12_4_ = 0x7fffffff;
            }
            auVar191 = ZEXT464(uVar82);
            auVar334 = ZEXT464((uint)fVar202);
            auVar303 = vminps_avx(_local_b30,_local_b50);
            auVar129 = vmaxps_avx(_local_b30,_local_b50);
            auVar95 = vminps_avx(_local_b40,_local_b60);
            auVar163 = vminps_avx(auVar303,auVar95);
            auVar303 = vmaxps_avx(_local_b40,_local_b60);
            auVar95 = vmaxps_avx(auVar129,auVar303);
            auVar129 = vandps_avx(auVar163,auVar208);
            auVar303 = vandps_avx(auVar95,auVar208);
            auVar129 = vmaxps_avx(auVar129,auVar303);
            auVar303 = vmovshdup_avx(auVar129);
            auVar303 = vmaxss_avx(auVar303,auVar129);
            auVar129 = vshufpd_avx(auVar129,auVar129,1);
            auVar129 = vmaxss_avx(auVar129,auVar303);
            local_ac0._0_4_ = auVar129._0_4_ * 1.9073486e-06;
            local_9a0._0_4_ = fVar231 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar95,auVar95,0xff);
            lVar83 = 5;
            do {
              fVar194 = auVar334._0_4_;
              fVar250 = 1.0 - fVar194;
              auVar303 = auVar334._0_16_;
              auVar129 = vshufps_avx(auVar303,auVar303,0);
              fVar202 = auVar129._0_4_;
              fVar231 = auVar129._4_4_;
              fVar192 = auVar129._8_4_;
              fVar222 = auVar129._12_4_;
              auVar129 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
              fVar224 = auVar129._0_4_;
              fVar253 = auVar129._4_4_;
              fVar196 = auVar129._8_4_;
              fVar226 = auVar129._12_4_;
              fVar256 = (float)local_b40._0_4_ * fVar202 + (float)local_b50._0_4_ * fVar224;
              fVar193 = (float)local_b40._4_4_ * fVar231 + (float)local_b50._4_4_ * fVar253;
              fVar195 = fStack_b38 * fVar192 + fStack_b48 * fVar196;
              fVar197 = fStack_b34 * fVar222 + fStack_b44 * fVar226;
              auVar237._0_4_ =
                   fVar224 * ((float)local_b50._0_4_ * fVar202 + fVar224 * (float)local_b30._0_4_) +
                   fVar202 * fVar256;
              auVar237._4_4_ =
                   fVar253 * ((float)local_b50._4_4_ * fVar231 + fVar253 * (float)local_b30._4_4_) +
                   fVar231 * fVar193;
              auVar237._8_4_ =
                   fVar196 * (fStack_b48 * fVar192 + fVar196 * fStack_b28) + fVar192 * fVar195;
              auVar237._12_4_ =
                   fVar226 * (fStack_b44 * fVar222 + fVar226 * fStack_b24) + fVar222 * fVar197;
              auVar180._0_4_ =
                   fVar224 * fVar256 +
                   fVar202 * (fVar202 * (float)local_b60._0_4_ + (float)local_b40._0_4_ * fVar224);
              auVar180._4_4_ =
                   fVar253 * fVar193 +
                   fVar231 * (fVar231 * (float)local_b60._4_4_ + (float)local_b40._4_4_ * fVar253);
              auVar180._8_4_ =
                   fVar196 * fVar195 + fVar192 * (fVar192 * fStack_b58 + fStack_b38 * fVar196);
              auVar180._12_4_ =
                   fVar226 * fVar197 + fVar222 * (fVar222 * fStack_b54 + fStack_b34 * fVar226);
              auVar129 = vshufps_avx(auVar191._0_16_,auVar191._0_16_,0);
              auVar121._0_4_ = auVar129._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar121._4_4_ = auVar129._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar121._8_4_ = auVar129._8_4_ * fStack_9a8 + 0.0;
              auVar121._12_4_ = auVar129._12_4_ * fStack_9a4 + 0.0;
              auVar90._0_4_ = fVar224 * auVar237._0_4_ + fVar202 * auVar180._0_4_;
              auVar90._4_4_ = fVar253 * auVar237._4_4_ + fVar231 * auVar180._4_4_;
              auVar90._8_4_ = fVar196 * auVar237._8_4_ + fVar192 * auVar180._8_4_;
              auVar90._12_4_ = fVar226 * auVar237._12_4_ + fVar222 * auVar180._12_4_;
              local_940._0_16_ = auVar90;
              auVar129 = vsubps_avx(auVar121,auVar90);
              _local_ae0 = auVar129;
              auVar129 = vdpps_avx(auVar129,auVar129,0x7f);
              fVar202 = auVar129._0_4_;
              if (fVar202 < 0.0) {
                fVar231 = sqrtf(fVar202);
                auVar334 = ZEXT1664(auVar303);
              }
              else {
                auVar303 = vsqrtss_avx(auVar129,auVar129);
                fVar231 = auVar303._0_4_;
              }
              auVar303 = vsubps_avx(auVar180,auVar237);
              auVar268._0_4_ = auVar303._0_4_ * 3.0;
              auVar268._4_4_ = auVar303._4_4_ * 3.0;
              auVar268._8_4_ = auVar303._8_4_ * 3.0;
              auVar268._12_4_ = auVar303._12_4_ * 3.0;
              fVar192 = auVar334._0_4_;
              auVar303 = vshufps_avx(ZEXT416((uint)(fVar192 * 6.0)),ZEXT416((uint)(fVar192 * 6.0)),0
                                    );
              auVar95 = ZEXT416((uint)((fVar250 - (fVar192 + fVar192)) * 6.0));
              auVar163 = vshufps_avx(auVar95,auVar95,0);
              auVar95 = ZEXT416((uint)((fVar192 - (fVar250 + fVar250)) * 6.0));
              auVar87 = vshufps_avx(auVar95,auVar95,0);
              auVar88 = vshufps_avx(ZEXT416((uint)(fVar250 * 6.0)),ZEXT416((uint)(fVar250 * 6.0)),0)
              ;
              auVar95 = vdpps_avx(auVar268,auVar268,0x7f);
              auVar122._0_4_ =
                   auVar88._0_4_ * (float)local_b30._0_4_ +
                   auVar87._0_4_ * (float)local_b50._0_4_ +
                   auVar303._0_4_ * (float)local_b60._0_4_ + auVar163._0_4_ * (float)local_b40._0_4_
              ;
              auVar122._4_4_ =
                   auVar88._4_4_ * (float)local_b30._4_4_ +
                   auVar87._4_4_ * (float)local_b50._4_4_ +
                   auVar303._4_4_ * (float)local_b60._4_4_ + auVar163._4_4_ * (float)local_b40._4_4_
              ;
              auVar122._8_4_ =
                   auVar88._8_4_ * fStack_b28 +
                   auVar87._8_4_ * fStack_b48 +
                   auVar303._8_4_ * fStack_b58 + auVar163._8_4_ * fStack_b38;
              auVar122._12_4_ =
                   auVar88._12_4_ * fStack_b24 +
                   auVar87._12_4_ * fStack_b44 +
                   auVar303._12_4_ * fStack_b54 + auVar163._12_4_ * fStack_b34;
              auVar303 = vblendps_avx(auVar95,_DAT_01feba10,0xe);
              auVar163 = vrsqrtss_avx(auVar303,auVar303);
              fVar222 = auVar163._0_4_;
              fVar192 = auVar95._0_4_;
              auVar163 = vdpps_avx(auVar268,auVar122,0x7f);
              auVar87 = vshufps_avx(auVar95,auVar95,0);
              auVar123._0_4_ = auVar122._0_4_ * auVar87._0_4_;
              auVar123._4_4_ = auVar122._4_4_ * auVar87._4_4_;
              auVar123._8_4_ = auVar122._8_4_ * auVar87._8_4_;
              auVar123._12_4_ = auVar122._12_4_ * auVar87._12_4_;
              auVar163 = vshufps_avx(auVar163,auVar163,0);
              auVar209._0_4_ = auVar268._0_4_ * auVar163._0_4_;
              auVar209._4_4_ = auVar268._4_4_ * auVar163._4_4_;
              auVar209._8_4_ = auVar268._8_4_ * auVar163._8_4_;
              auVar209._12_4_ = auVar268._12_4_ * auVar163._12_4_;
              auVar88 = vsubps_avx(auVar123,auVar209);
              auVar163 = vrcpss_avx(auVar303,auVar303);
              auVar303 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                    ZEXT416((uint)(auVar191._0_4_ * (float)local_9a0._0_4_)));
              auVar163 = ZEXT416((uint)(auVar163._0_4_ * (2.0 - fVar192 * auVar163._0_4_)));
              auVar163 = vshufps_avx(auVar163,auVar163,0);
              uVar81 = CONCAT44(auVar268._4_4_,auVar268._0_4_);
              local_960._0_8_ = uVar81 ^ 0x8000000080000000;
              local_960._8_4_ = -auVar268._8_4_;
              local_960._12_4_ = -auVar268._12_4_;
              auVar87 = ZEXT416((uint)(fVar222 * 1.5 + fVar192 * -0.5 * fVar222 * fVar222 * fVar222)
                               );
              auVar87 = vshufps_avx(auVar87,auVar87,0);
              auVar181._0_4_ = auVar87._0_4_ * auVar88._0_4_ * auVar163._0_4_;
              auVar181._4_4_ = auVar87._4_4_ * auVar88._4_4_ * auVar163._4_4_;
              auVar181._8_4_ = auVar87._8_4_ * auVar88._8_4_ * auVar163._8_4_;
              auVar181._12_4_ = auVar87._12_4_ * auVar88._12_4_ * auVar163._12_4_;
              auVar331._0_4_ = auVar268._0_4_ * auVar87._0_4_;
              auVar331._4_4_ = auVar268._4_4_ * auVar87._4_4_;
              auVar331._8_4_ = auVar268._8_4_ * auVar87._8_4_;
              auVar331._12_4_ = auVar268._12_4_ * auVar87._12_4_;
              if (fVar192 < 0.0) {
                local_a20._0_16_ = auVar331;
                local_b20._0_16_ = auVar181;
                fVar192 = sqrtf(fVar192);
                auVar181 = local_b20._0_16_;
                auVar331 = local_a20._0_16_;
              }
              else {
                auVar95 = vsqrtss_avx(auVar95,auVar95);
                fVar192 = auVar95._0_4_;
              }
              auVar95 = vdpps_avx(_local_ae0,auVar331,0x7f);
              fVar231 = ((float)local_ac0._0_4_ / fVar192) * (fVar231 + 1.0) +
                        auVar303._0_4_ + fVar231 * (float)local_ac0._0_4_;
              auVar163 = vdpps_avx(local_960._0_16_,auVar331,0x7f);
              auVar87 = vdpps_avx(_local_ae0,auVar181,0x7f);
              auVar88 = vdpps_avx(_local_9b0,auVar331,0x7f);
              auVar119 = vdpps_avx(_local_ae0,local_960._0_16_,0x7f);
              fVar192 = auVar163._0_4_ + auVar87._0_4_;
              fVar222 = auVar95._0_4_;
              auVar91._0_4_ = fVar222 * fVar222;
              auVar91._4_4_ = auVar95._4_4_ * auVar95._4_4_;
              auVar91._8_4_ = auVar95._8_4_ * auVar95._8_4_;
              auVar91._12_4_ = auVar95._12_4_ * auVar95._12_4_;
              auVar87 = vsubps_avx(auVar129,auVar91);
              local_960._0_16_ = ZEXT416((uint)fVar192);
              auVar163 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
              fVar250 = auVar119._0_4_ - fVar222 * fVar192;
              fVar222 = auVar163._0_4_ - fVar222 * auVar88._0_4_;
              auVar163 = vrsqrtss_avx(auVar87,auVar87);
              fVar224 = auVar87._0_4_;
              fVar192 = auVar163._0_4_;
              fVar192 = fVar192 * 1.5 + fVar224 * -0.5 * fVar192 * fVar192 * fVar192;
              if (fVar224 < 0.0) {
                local_a20._0_16_ = auVar95;
                local_b20._0_16_ = auVar88;
                local_780._0_4_ = fVar250;
                local_7a0._0_4_ = fVar222;
                local_7c0._0_4_ = fVar192;
                fVar224 = sqrtf(fVar224);
                fVar192 = (float)local_7c0._0_4_;
                fVar250 = (float)local_780._0_4_;
                fVar222 = (float)local_7a0._0_4_;
                auVar88 = local_b20._0_16_;
                auVar95 = local_a20._0_16_;
              }
              else {
                auVar163 = vsqrtss_avx(auVar87,auVar87);
                fVar224 = auVar163._0_4_;
              }
              auVar86 = vpermilps_avx(local_940._0_16_,0xff);
              auVar119 = vshufps_avx(auVar268,auVar268,0xff);
              fVar253 = fVar250 * fVar192 - auVar119._0_4_;
              auVar210._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar210._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar210._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar238._0_4_ = -fVar253;
              auVar238._4_4_ = 0x80000000;
              auVar238._8_4_ = 0x80000000;
              auVar238._12_4_ = 0x80000000;
              fVar250 = local_960._0_4_ * fVar222 * fVar192;
              auVar276 = ZEXT464((uint)fVar250);
              auVar163 = vinsertps_avx(ZEXT416((uint)(fVar222 * fVar192)),auVar210,0x10);
              auVar87 = vmovsldup_avx(ZEXT416((uint)(fVar250 - auVar88._0_4_ * fVar253)));
              auVar163 = vdivps_avx(auVar163,auVar87);
              auVar86 = ZEXT416((uint)(fVar224 - auVar86._0_4_));
              auVar88 = vinsertps_avx(auVar95,auVar86,0x10);
              auVar182._0_4_ = auVar88._0_4_ * auVar163._0_4_;
              auVar182._4_4_ = auVar88._4_4_ * auVar163._4_4_;
              auVar182._8_4_ = auVar88._8_4_ * auVar163._8_4_;
              auVar182._12_4_ = auVar88._12_4_ * auVar163._12_4_;
              auVar163 = vinsertps_avx(auVar238,local_960._0_16_,0x1c);
              auVar163 = vdivps_avx(auVar163,auVar87);
              auVar87 = vhaddps_avx(auVar182,auVar182);
              auVar160._0_4_ = auVar88._0_4_ * auVar163._0_4_;
              auVar160._4_4_ = auVar88._4_4_ * auVar163._4_4_;
              auVar160._8_4_ = auVar88._8_4_ * auVar163._8_4_;
              auVar160._12_4_ = auVar88._12_4_ * auVar163._12_4_;
              auVar163 = vhaddps_avx(auVar160,auVar160);
              fVar194 = fVar194 - auVar87._0_4_;
              auVar334 = ZEXT464((uint)fVar194);
              fVar192 = auVar191._0_4_ - auVar163._0_4_;
              auVar191 = ZEXT464((uint)fVar192);
              auVar211._8_4_ = 0x7fffffff;
              auVar211._0_8_ = 0x7fffffff7fffffff;
              auVar211._12_4_ = 0x7fffffff;
              auVar221 = ZEXT1664(auVar211);
              auVar95 = vandps_avx(auVar95,auVar211);
              bVar45 = true;
              fVar222 = (float)local_980._0_4_;
              fVar250 = (float)local_980._4_4_;
              fVar224 = fStack_978;
              fVar253 = fStack_974;
              fVar196 = fStack_970;
              fVar226 = fStack_96c;
              fVar256 = fStack_968;
              fVar203 = (float)local_b00._0_4_;
              fVar223 = (float)local_b00._4_4_;
              fVar225 = fStack_af8;
              fVar227 = fStack_af4;
              fVar228 = fStack_af0;
              fVar229 = fStack_aec;
              fVar230 = fStack_ae8;
              fVar193 = (float)local_a00._0_4_;
              fVar195 = (float)local_a00._4_4_;
              fVar197 = fStack_9f8;
              fVar198 = fStack_9f4;
              fVar199 = fStack_9f0;
              fVar200 = fStack_9ec;
              fVar201 = fStack_9e8;
              if (auVar95._0_4_ < fVar231) {
                auVar95 = vandps_avx(auVar86,auVar211);
                if (auVar95._0_4_ <
                    (float)local_7e0._0_4_ * 1.9073486e-06 + auVar303._0_4_ + fVar231) {
                  fVar192 = fVar192 + (float)local_920._0_4_;
                  auVar191 = ZEXT464((uint)fVar192);
                  if (fVar177 <= fVar192) {
                    fVar231 = *(float *)(ray + k * 4 + 0x100);
                    auVar276 = ZEXT464((uint)fVar231);
                    if (((fVar192 <= fVar231) && (0.0 <= fVar194)) && (fVar194 <= 1.0)) {
                      auVar129 = vrsqrtss_avx(auVar129,auVar129);
                      fVar232 = auVar129._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar80].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        unaff_BL = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar129 = ZEXT416((uint)(fVar232 * 1.5 +
                                                   fVar202 * -0.5 * fVar232 * fVar232 * fVar232));
                          auVar129 = vshufps_avx(auVar129,auVar129,0);
                          auVar124._0_4_ = auVar129._0_4_ * (float)local_ae0._0_4_;
                          auVar124._4_4_ = auVar129._4_4_ * (float)local_ae0._4_4_;
                          auVar124._8_4_ = auVar129._8_4_ * fStack_ad8;
                          auVar124._12_4_ = auVar129._12_4_ * fStack_ad4;
                          auVar92._0_4_ = auVar268._0_4_ + auVar119._0_4_ * auVar124._0_4_;
                          auVar92._4_4_ = auVar268._4_4_ + auVar119._4_4_ * auVar124._4_4_;
                          auVar92._8_4_ = auVar268._8_4_ + auVar119._8_4_ * auVar124._8_4_;
                          auVar92._12_4_ = auVar268._12_4_ + auVar119._12_4_ * auVar124._12_4_;
                          auVar129 = vshufps_avx(auVar124,auVar124,0xc9);
                          auVar303 = vshufps_avx(auVar268,auVar268,0xc9);
                          auVar125._0_4_ = auVar303._0_4_ * auVar124._0_4_;
                          auVar125._4_4_ = auVar303._4_4_ * auVar124._4_4_;
                          auVar125._8_4_ = auVar303._8_4_ * auVar124._8_4_;
                          auVar125._12_4_ = auVar303._12_4_ * auVar124._12_4_;
                          auVar161._0_4_ = auVar268._0_4_ * auVar129._0_4_;
                          auVar161._4_4_ = auVar268._4_4_ * auVar129._4_4_;
                          auVar161._8_4_ = auVar268._8_4_ * auVar129._8_4_;
                          auVar161._12_4_ = auVar268._12_4_ * auVar129._12_4_;
                          auVar95 = vsubps_avx(auVar161,auVar125);
                          auVar129 = vshufps_avx(auVar95,auVar95,0xc9);
                          auVar303 = vshufps_avx(auVar92,auVar92,0xc9);
                          auVar162._0_4_ = auVar303._0_4_ * auVar129._0_4_;
                          auVar162._4_4_ = auVar303._4_4_ * auVar129._4_4_;
                          auVar162._8_4_ = auVar303._8_4_ * auVar129._8_4_;
                          auVar162._12_4_ = auVar303._12_4_ * auVar129._12_4_;
                          auVar129 = vshufps_avx(auVar95,auVar95,0xd2);
                          auVar93._0_4_ = auVar92._0_4_ * auVar129._0_4_;
                          auVar93._4_4_ = auVar92._4_4_ * auVar129._4_4_;
                          auVar93._8_4_ = auVar92._8_4_ * auVar129._8_4_;
                          auVar93._12_4_ = auVar92._12_4_ * auVar129._12_4_;
                          auVar129 = vsubps_avx(auVar162,auVar93);
                          pRVar5 = context->user;
                          auVar303 = ZEXT416((uint)fVar194);
                          local_570 = vshufps_avx(auVar303,auVar303,0);
                          auStack_5d0 = vshufps_avx(auVar129,auVar129,0x55);
                          local_5b0 = vshufps_avx(auVar129,auVar129,0xaa);
                          local_590 = vshufps_avx(auVar129,auVar129,0);
                          local_5e0 = (RTCHitN  [16])auStack_5d0;
                          local_5c0 = local_5b0;
                          local_5a0 = local_590;
                          local_580 = local_570;
                          local_560 = ZEXT832(0) << 0x20;
                          local_540 = local_4a0._0_8_;
                          uStack_538 = local_4a0._8_8_;
                          uStack_530 = local_4a0._16_8_;
                          uStack_528 = local_4a0._24_8_;
                          local_520 = local_480._0_8_;
                          uStack_518 = local_480._8_8_;
                          uStack_510 = local_480._16_8_;
                          uStack_508 = local_480._24_8_;
                          local_a78[1] = local_a40;
                          *local_a78 = local_a40;
                          local_500 = pRVar5->instID[0];
                          uStack_4fc = local_500;
                          uStack_4f8 = local_500;
                          uStack_4f4 = local_500;
                          uStack_4f0 = local_500;
                          uStack_4ec = local_500;
                          uStack_4e8 = local_500;
                          uStack_4e4 = local_500;
                          local_4e0 = pRVar5->instPrimID[0];
                          uStack_4dc = local_4e0;
                          uStack_4d8 = local_4e0;
                          uStack_4d4 = local_4e0;
                          uStack_4d0 = local_4e0;
                          uStack_4cc = local_4e0;
                          uStack_4c8 = local_4e0;
                          uStack_4c4 = local_4e0;
                          *(float *)(ray + k * 4 + 0x100) = fVar192;
                          local_b80 = *local_a80;
                          uStack_b78 = local_a80[1];
                          local_b70 = *local_a88;
                          uStack_b68 = local_a88[1];
                          local_a70.valid = (int *)&local_b80;
                          local_a70.geometryUserPtr = pGVar4->userPtr;
                          local_a70.context = context->user;
                          local_a70.hit = local_5e0;
                          local_a70.N = 8;
                          local_a70.ray = (RTCRayN *)ray;
                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->occlusionFilterN)(&local_a70);
                            auVar334 = ZEXT1664(auVar303);
                            auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            fVar222 = (float)local_980._0_4_;
                            fVar250 = (float)local_980._4_4_;
                            fVar224 = fStack_978;
                            fVar253 = fStack_974;
                            fVar196 = fStack_970;
                            fVar226 = fStack_96c;
                            fVar256 = fStack_968;
                            fVar193 = (float)local_a00._0_4_;
                            fVar195 = (float)local_a00._4_4_;
                            fVar197 = fStack_9f8;
                            fVar198 = fStack_9f4;
                            fVar199 = fStack_9f0;
                            fVar200 = fStack_9ec;
                            fVar201 = fStack_9e8;
                          }
                          auVar67._8_8_ = uStack_b78;
                          auVar67._0_8_ = local_b80;
                          auVar129 = vpcmpeqd_avx((undefined1  [16])0x0,auVar67);
                          auVar71._8_8_ = uStack_b68;
                          auVar71._0_8_ = local_b70;
                          auVar303 = vpcmpeqd_avx((undefined1  [16])0x0,auVar71);
                          auVar106._16_16_ = auVar303;
                          auVar106._0_16_ = auVar129;
                          auVar105 = local_a40 & ~auVar106;
                          fVar203 = (float)local_b00._0_4_;
                          fVar223 = (float)local_b00._4_4_;
                          fVar225 = fStack_af8;
                          fVar227 = fStack_af4;
                          fVar228 = fStack_af0;
                          fVar229 = fStack_aec;
                          fVar230 = fStack_ae8;
                          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar105 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar105 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar105 >> 0x7f,0) == '\0') &&
                                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar105 >> 0xbf,0) == '\0') &&
                              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar105[0x1f]) {
                            auVar107._0_4_ = auVar129._0_4_ ^ local_a40._0_4_;
                            auVar107._4_4_ = auVar129._4_4_ ^ local_a40._4_4_;
                            auVar107._8_4_ = auVar129._8_4_ ^ local_a40._8_4_;
                            auVar107._12_4_ = auVar129._12_4_ ^ local_a40._12_4_;
                            auVar107._16_4_ = auVar303._0_4_ ^ local_a40._16_4_;
                            auVar107._20_4_ = auVar303._4_4_ ^ local_a40._20_4_;
                            auVar107._24_4_ = auVar303._8_4_ ^ local_a40._24_4_;
                            auVar107._28_4_ = auVar303._12_4_ ^ local_a40._28_4_;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&local_a70);
                              auVar334 = ZEXT1664(auVar334._0_16_);
                              auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar222 = (float)local_980._0_4_;
                              fVar250 = (float)local_980._4_4_;
                              fVar224 = fStack_978;
                              fVar253 = fStack_974;
                              fVar196 = fStack_970;
                              fVar226 = fStack_96c;
                              fVar256 = fStack_968;
                              fVar203 = (float)local_b00._0_4_;
                              fVar223 = (float)local_b00._4_4_;
                              fVar225 = fStack_af8;
                              fVar227 = fStack_af4;
                              fVar228 = fStack_af0;
                              fVar229 = fStack_aec;
                              fVar230 = fStack_ae8;
                              fVar193 = (float)local_a00._0_4_;
                              fVar195 = (float)local_a00._4_4_;
                              fVar197 = fStack_9f8;
                              fVar198 = fStack_9f4;
                              fVar199 = fStack_9f0;
                              fVar200 = fStack_9ec;
                              fVar201 = fStack_9e8;
                            }
                            auVar68._8_8_ = uStack_b78;
                            auVar68._0_8_ = local_b80;
                            auVar129 = vpcmpeqd_avx((undefined1  [16])0x0,auVar68);
                            auVar72._8_8_ = uStack_b68;
                            auVar72._0_8_ = local_b70;
                            auVar303 = vpcmpeqd_avx((undefined1  [16])0x0,auVar72);
                            auVar143._16_16_ = auVar303;
                            auVar143._0_16_ = auVar129;
                            auVar107._0_4_ = auVar129._0_4_ ^ local_a40._0_4_;
                            auVar107._4_4_ = auVar129._4_4_ ^ local_a40._4_4_;
                            auVar107._8_4_ = auVar129._8_4_ ^ local_a40._8_4_;
                            auVar107._12_4_ = auVar129._12_4_ ^ local_a40._12_4_;
                            auVar107._16_4_ = auVar303._0_4_ ^ local_a40._16_4_;
                            auVar107._20_4_ = auVar303._4_4_ ^ local_a40._20_4_;
                            auVar107._24_4_ = auVar303._8_4_ ^ local_a40._24_4_;
                            auVar107._28_4_ = auVar303._12_4_ ^ local_a40._28_4_;
                            auVar170._8_4_ = 0xff800000;
                            auVar170._0_8_ = 0xff800000ff800000;
                            auVar170._12_4_ = 0xff800000;
                            auVar170._16_4_ = 0xff800000;
                            auVar170._20_4_ = 0xff800000;
                            auVar170._24_4_ = 0xff800000;
                            auVar170._28_4_ = 0xff800000;
                            auVar105 = vblendvps_avx(auVar170,*(undefined1 (*) [32])
                                                               (local_a70.ray + 0x100),auVar143);
                            *(undefined1 (*) [32])(local_a70.ray + 0x100) = auVar105;
                          }
                          auVar191 = ZEXT464((uint)fVar192);
                          auVar276 = ZEXT464((uint)fVar231);
                          bVar65 = (auVar107 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar66 = (auVar107 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar64 = (auVar107 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar63 = SUB321(auVar107 >> 0x7f,0) != '\0';
                          bVar62 = (auVar107 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar61 = SUB321(auVar107 >> 0xbf,0) != '\0';
                          bVar60 = (auVar107 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar45 = auVar107[0x1f] < '\0';
                          unaff_BL = ((((((bVar65 || bVar66) || bVar64) || bVar63) || bVar62) ||
                                      bVar61) || bVar60) || bVar45;
                          if (((((((!bVar65 && !bVar66) && !bVar64) && !bVar63) && !bVar62) &&
                               !bVar61) && !bVar60) && !bVar45) {
                            *(float *)(ray + k * 4 + 0x100) = fVar231;
                          }
                          bVar45 = false;
                          goto LAB_00ecc26d;
                        }
                        unaff_BL = 1;
                      }
                      bVar45 = false;
                      goto LAB_00ecc26d;
                    }
                  }
                  bVar45 = false;
                  unaff_BL = 0;
                }
              }
LAB_00ecc26d:
              if (!bVar45) goto LAB_00ecc62a;
              lVar83 = lVar83 + -1;
            } while (lVar83 != 0);
            unaff_BL = 0;
            fVar203 = (float)local_b00._0_4_;
            fVar223 = (float)local_b00._4_4_;
            fVar225 = fStack_af8;
            fVar227 = fStack_af4;
            fVar228 = fStack_af0;
            fVar229 = fStack_aec;
            fVar230 = fStack_ae8;
            fVar193 = (float)local_a00._0_4_;
            fVar195 = (float)local_a00._4_4_;
            fVar197 = fStack_9f8;
            fVar198 = fStack_9f4;
            fVar199 = fStack_9f0;
            fVar200 = fStack_9ec;
            fVar201 = fStack_9e8;
LAB_00ecc62a:
            unaff_BL = unaff_BL & 1;
            uVar85 = CONCAT71(local_800._1_7_,local_800[0] | unaff_BL);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar108._4_4_ = uVar1;
            auVar108._0_4_ = uVar1;
            auVar108._8_4_ = uVar1;
            auVar108._12_4_ = uVar1;
            auVar108._16_4_ = uVar1;
            auVar108._20_4_ = uVar1;
            auVar108._24_4_ = uVar1;
            auVar108._28_4_ = uVar1;
            auVar105 = vcmpps_avx(_local_860,auVar108,2);
            auVar100 = vandps_avx(auVar105,local_700);
            auVar191 = ZEXT3264(auVar100);
            auVar10 = local_700 & auVar105;
            uVar81 = local_740;
            local_700 = auVar100;
          } while ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar10 >> 0x7f,0) != '\0') ||
                     (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar10 >> 0xbf,0) != '\0') ||
                   (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar10[0x1f] < '\0');
        }
        auVar109._0_4_ =
             fVar203 * (float)local_8c0._0_4_ +
             fVar193 * (float)local_8e0._0_4_ + fVar222 * (float)local_880._0_4_;
        auVar109._4_4_ =
             fVar223 * (float)local_8c0._4_4_ +
             fVar195 * (float)local_8e0._4_4_ + fVar250 * (float)local_880._4_4_;
        auVar109._8_4_ = fVar225 * fStack_8b8 + fVar197 * fStack_8d8 + fVar224 * fStack_878;
        auVar109._12_4_ = fVar227 * fStack_8b4 + fVar198 * fStack_8d4 + fVar253 * fStack_874;
        auVar109._16_4_ = fVar228 * fStack_8b0 + fVar199 * fStack_8d0 + fVar196 * fStack_870;
        auVar109._20_4_ = fVar229 * fStack_8ac + fVar200 * fStack_8cc + fVar226 * fStack_86c;
        auVar109._24_4_ = fVar230 * fStack_8a8 + fVar201 * fStack_8c8 + fVar256 * fStack_868;
        auVar109._28_4_ = auVar105._28_4_ + auVar105._28_4_ + auVar191._28_4_;
        auVar144._8_4_ = 0x7fffffff;
        auVar144._0_8_ = 0x7fffffff7fffffff;
        auVar144._12_4_ = 0x7fffffff;
        auVar144._16_4_ = 0x7fffffff;
        auVar144._20_4_ = 0x7fffffff;
        auVar144._24_4_ = 0x7fffffff;
        auVar144._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar109,auVar144);
        auVar145._8_4_ = 0x3e99999a;
        auVar145._0_8_ = 0x3e99999a3e99999a;
        auVar145._12_4_ = 0x3e99999a;
        auVar145._16_4_ = 0x3e99999a;
        auVar145._20_4_ = 0x3e99999a;
        auVar145._24_4_ = 0x3e99999a;
        auVar145._28_4_ = 0x3e99999a;
        auVar105 = vcmpps_avx(auVar105,auVar145,1);
        auVar100 = vorps_avx(auVar105,local_6e0);
        auVar146._0_4_ = local_9e0 + (float)local_6a0._0_4_;
        auVar146._4_4_ = fStack_9dc + (float)local_6a0._4_4_;
        auVar146._8_4_ = fStack_9d8 + fStack_698;
        auVar146._12_4_ = fStack_9d4 + fStack_694;
        auVar146._16_4_ = fStack_9d0 + fStack_690;
        auVar146._20_4_ = fStack_9cc + fStack_68c;
        auVar146._24_4_ = fStack_9c8 + fStack_688;
        auVar146._28_4_ = fStack_9c4 + fStack_684;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar171._4_4_ = uVar1;
        auVar171._0_4_ = uVar1;
        auVar171._8_4_ = uVar1;
        auVar171._12_4_ = uVar1;
        auVar171._16_4_ = uVar1;
        auVar171._20_4_ = uVar1;
        auVar171._24_4_ = uVar1;
        auVar171._28_4_ = uVar1;
        auVar105 = vcmpps_avx(auVar146,auVar171,2);
        _local_8c0 = vandps_avx(auVar105,local_840);
        auVar147._8_4_ = 3;
        auVar147._0_8_ = 0x300000003;
        auVar147._12_4_ = 3;
        auVar147._16_4_ = 3;
        auVar147._20_4_ = 3;
        auVar147._24_4_ = 3;
        auVar147._28_4_ = 3;
        auVar172._8_4_ = 2;
        auVar172._0_8_ = 0x200000002;
        auVar172._12_4_ = 2;
        auVar172._16_4_ = 2;
        auVar172._20_4_ = 2;
        auVar172._24_4_ = 2;
        auVar172._28_4_ = 2;
        auVar105 = vblendvps_avx(auVar172,auVar147,auVar100);
        auVar129 = vpcmpgtd_avx(auVar105._16_16_,local_760);
        auVar303 = vpshufd_avx(local_6c0._0_16_,0);
        auVar303 = vpcmpgtd_avx(auVar105._0_16_,auVar303);
        auVar148._16_16_ = auVar129;
        auVar148._0_16_ = auVar303;
        _local_8e0 = vblendps_avx(ZEXT1632(auVar303),auVar148,0xf0);
        auVar105 = vandnps_avx(_local_8e0,_local_8c0);
        auVar100 = _local_8c0 & ~_local_8e0;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          local_840 = _local_3e0;
          local_860._4_4_ = fStack_9dc + (float)local_3e0._4_4_;
          local_860._0_4_ = local_9e0 + (float)local_3e0._0_4_;
          fStack_858 = fStack_9d8 + fStack_3d8;
          fStack_854 = fStack_9d4 + fStack_3d4;
          fStack_850 = fStack_9d0 + fStack_3d0;
          fStack_84c = fStack_9cc + fStack_3cc;
          fStack_848 = fStack_9c8 + fStack_3c8;
          fStack_844 = fStack_9c4 + fStack_3c4;
          do {
            auVar212 = auVar221._0_16_;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar100 = vblendvps_avx(auVar149,local_840,auVar105);
            auVar10 = vshufps_avx(auVar100,auVar100,0xb1);
            auVar10 = vminps_avx(auVar100,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vperm2f128_avx(auVar10,auVar10,1);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar10 = vcmpps_avx(auVar100,auVar10,0);
            auVar11 = auVar105 & auVar10;
            auVar100 = auVar105;
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0x7f,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0x1f] < '\0') {
              auVar100 = vandps_avx(auVar10,auVar105);
            }
            local_800._0_8_ = uVar85;
            uVar77 = vmovmskps_avx(auVar100);
            uVar82 = 0;
            if (uVar77 != 0) {
              for (; (uVar77 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
              }
            }
            uVar81 = (ulong)uVar82;
            local_720 = auVar105;
            *(undefined4 *)(local_720 + uVar81 * 4) = 0;
            fVar202 = local_640[uVar81];
            uVar82 = *(uint *)(local_3c0 + uVar81 * 4);
            fVar231 = auVar8._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar231 = sqrtf((float)local_9c0._0_4_);
              auVar212._8_4_ = 0x7fffffff;
              auVar212._0_8_ = 0x7fffffff7fffffff;
              auVar212._12_4_ = 0x7fffffff;
            }
            auVar334 = ZEXT464(uVar82);
            auVar191 = ZEXT464((uint)fVar202);
            auVar303 = vminps_avx(_local_b30,_local_b50);
            auVar129 = vmaxps_avx(_local_b30,_local_b50);
            auVar95 = vminps_avx(_local_b40,_local_b60);
            auVar163 = vminps_avx(auVar303,auVar95);
            auVar303 = vmaxps_avx(_local_b40,_local_b60);
            auVar95 = vmaxps_avx(auVar129,auVar303);
            auVar129 = vandps_avx(auVar163,auVar212);
            auVar303 = vandps_avx(auVar95,auVar212);
            auVar129 = vmaxps_avx(auVar129,auVar303);
            auVar303 = vmovshdup_avx(auVar129);
            auVar303 = vmaxss_avx(auVar303,auVar129);
            auVar129 = vshufpd_avx(auVar129,auVar129,1);
            auVar129 = vmaxss_avx(auVar129,auVar303);
            local_ac0._0_4_ = auVar129._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar231 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar95,auVar95,0xff);
            lVar83 = 5;
            do {
              fVar194 = auVar191._0_4_;
              fVar250 = 1.0 - fVar194;
              auVar303 = auVar191._0_16_;
              auVar129 = vshufps_avx(auVar303,auVar303,0);
              fVar202 = auVar129._0_4_;
              fVar231 = auVar129._4_4_;
              fVar192 = auVar129._8_4_;
              fVar222 = auVar129._12_4_;
              auVar129 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
              fVar224 = auVar129._0_4_;
              fVar253 = auVar129._4_4_;
              fVar196 = auVar129._8_4_;
              fVar226 = auVar129._12_4_;
              fVar256 = (float)local_b40._0_4_ * fVar202 + (float)local_b50._0_4_ * fVar224;
              fVar193 = (float)local_b40._4_4_ * fVar231 + (float)local_b50._4_4_ * fVar253;
              fVar195 = fStack_b38 * fVar192 + fStack_b48 * fVar196;
              fVar197 = fStack_b34 * fVar222 + fStack_b44 * fVar226;
              auVar239._0_4_ =
                   fVar224 * ((float)local_b50._0_4_ * fVar202 + fVar224 * (float)local_b30._0_4_) +
                   fVar202 * fVar256;
              auVar239._4_4_ =
                   fVar253 * ((float)local_b50._4_4_ * fVar231 + fVar253 * (float)local_b30._4_4_) +
                   fVar231 * fVar193;
              auVar239._8_4_ =
                   fVar196 * (fStack_b48 * fVar192 + fVar196 * fStack_b28) + fVar192 * fVar195;
              auVar239._12_4_ =
                   fVar226 * (fStack_b44 * fVar222 + fVar226 * fStack_b24) + fVar222 * fVar197;
              auVar183._0_4_ =
                   fVar224 * fVar256 +
                   fVar202 * (fVar202 * (float)local_b60._0_4_ + (float)local_b40._0_4_ * fVar224);
              auVar183._4_4_ =
                   fVar253 * fVar193 +
                   fVar231 * (fVar231 * (float)local_b60._4_4_ + (float)local_b40._4_4_ * fVar253);
              auVar183._8_4_ =
                   fVar196 * fVar195 + fVar192 * (fVar192 * fStack_b58 + fStack_b38 * fVar196);
              auVar183._12_4_ =
                   fVar226 * fVar197 + fVar222 * (fVar222 * fStack_b54 + fStack_b34 * fVar226);
              auVar129 = vshufps_avx(auVar334._0_16_,auVar334._0_16_,0);
              auVar126._0_4_ = auVar129._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar126._4_4_ = auVar129._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar126._8_4_ = auVar129._8_4_ * fStack_9a8 + 0.0;
              auVar126._12_4_ = auVar129._12_4_ * fStack_9a4 + 0.0;
              auVar94._0_4_ = fVar224 * auVar239._0_4_ + fVar202 * auVar183._0_4_;
              auVar94._4_4_ = fVar253 * auVar239._4_4_ + fVar231 * auVar183._4_4_;
              auVar94._8_4_ = fVar196 * auVar239._8_4_ + fVar192 * auVar183._8_4_;
              auVar94._12_4_ = fVar226 * auVar239._12_4_ + fVar222 * auVar183._12_4_;
              local_940._0_16_ = auVar94;
              auVar129 = vsubps_avx(auVar126,auVar94);
              _local_ae0 = auVar129;
              auVar129 = vdpps_avx(auVar129,auVar129,0x7f);
              fVar202 = auVar129._0_4_;
              if (fVar202 < 0.0) {
                fVar231 = sqrtf(fVar202);
                auVar191 = ZEXT1664(auVar303);
              }
              else {
                auVar303 = vsqrtss_avx(auVar129,auVar129);
                fVar231 = auVar303._0_4_;
              }
              auVar303 = vsubps_avx(auVar183,auVar239);
              auVar269._0_4_ = auVar303._0_4_ * 3.0;
              auVar269._4_4_ = auVar303._4_4_ * 3.0;
              auVar269._8_4_ = auVar303._8_4_ * 3.0;
              auVar269._12_4_ = auVar303._12_4_ * 3.0;
              fVar192 = auVar191._0_4_;
              auVar303 = vshufps_avx(ZEXT416((uint)(fVar192 * 6.0)),ZEXT416((uint)(fVar192 * 6.0)),0
                                    );
              auVar95 = ZEXT416((uint)((fVar250 - (fVar192 + fVar192)) * 6.0));
              auVar163 = vshufps_avx(auVar95,auVar95,0);
              auVar95 = ZEXT416((uint)((fVar192 - (fVar250 + fVar250)) * 6.0));
              auVar87 = vshufps_avx(auVar95,auVar95,0);
              auVar88 = vshufps_avx(ZEXT416((uint)(fVar250 * 6.0)),ZEXT416((uint)(fVar250 * 6.0)),0)
              ;
              auVar95 = vdpps_avx(auVar269,auVar269,0x7f);
              auVar127._0_4_ =
                   auVar88._0_4_ * (float)local_b30._0_4_ +
                   auVar87._0_4_ * (float)local_b50._0_4_ +
                   auVar303._0_4_ * (float)local_b60._0_4_ + auVar163._0_4_ * (float)local_b40._0_4_
              ;
              auVar127._4_4_ =
                   auVar88._4_4_ * (float)local_b30._4_4_ +
                   auVar87._4_4_ * (float)local_b50._4_4_ +
                   auVar303._4_4_ * (float)local_b60._4_4_ + auVar163._4_4_ * (float)local_b40._4_4_
              ;
              auVar127._8_4_ =
                   auVar88._8_4_ * fStack_b28 +
                   auVar87._8_4_ * fStack_b48 +
                   auVar303._8_4_ * fStack_b58 + auVar163._8_4_ * fStack_b38;
              auVar127._12_4_ =
                   auVar88._12_4_ * fStack_b24 +
                   auVar87._12_4_ * fStack_b44 +
                   auVar303._12_4_ * fStack_b54 + auVar163._12_4_ * fStack_b34;
              auVar303 = vblendps_avx(auVar95,_DAT_01feba10,0xe);
              auVar163 = vrsqrtss_avx(auVar303,auVar303);
              fVar222 = auVar163._0_4_;
              fVar192 = auVar95._0_4_;
              auVar163 = vdpps_avx(auVar269,auVar127,0x7f);
              auVar87 = vshufps_avx(auVar95,auVar95,0);
              auVar128._0_4_ = auVar127._0_4_ * auVar87._0_4_;
              auVar128._4_4_ = auVar127._4_4_ * auVar87._4_4_;
              auVar128._8_4_ = auVar127._8_4_ * auVar87._8_4_;
              auVar128._12_4_ = auVar127._12_4_ * auVar87._12_4_;
              auVar163 = vshufps_avx(auVar163,auVar163,0);
              auVar213._0_4_ = auVar269._0_4_ * auVar163._0_4_;
              auVar213._4_4_ = auVar269._4_4_ * auVar163._4_4_;
              auVar213._8_4_ = auVar269._8_4_ * auVar163._8_4_;
              auVar213._12_4_ = auVar269._12_4_ * auVar163._12_4_;
              auVar88 = vsubps_avx(auVar128,auVar213);
              auVar163 = vrcpss_avx(auVar303,auVar303);
              auVar303 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                    ZEXT416((uint)(auVar334._0_4_ * (float)local_960._0_4_)));
              auVar163 = ZEXT416((uint)(auVar163._0_4_ * (2.0 - fVar192 * auVar163._0_4_)));
              auVar163 = vshufps_avx(auVar163,auVar163,0);
              uVar81 = CONCAT44(auVar269._4_4_,auVar269._0_4_);
              auVar240._0_8_ = uVar81 ^ 0x8000000080000000;
              auVar240._8_4_ = -auVar269._8_4_;
              auVar240._12_4_ = -auVar269._12_4_;
              auVar87 = ZEXT416((uint)(fVar222 * 1.5 + fVar192 * -0.5 * fVar222 * fVar222 * fVar222)
                               );
              auVar87 = vshufps_avx(auVar87,auVar87,0);
              auVar184._0_4_ = auVar87._0_4_ * auVar88._0_4_ * auVar163._0_4_;
              auVar184._4_4_ = auVar87._4_4_ * auVar88._4_4_ * auVar163._4_4_;
              auVar184._8_4_ = auVar87._8_4_ * auVar88._8_4_ * auVar163._8_4_;
              auVar184._12_4_ = auVar87._12_4_ * auVar88._12_4_ * auVar163._12_4_;
              auVar304._0_4_ = auVar269._0_4_ * auVar87._0_4_;
              auVar304._4_4_ = auVar269._4_4_ * auVar87._4_4_;
              auVar304._8_4_ = auVar269._8_4_ * auVar87._8_4_;
              auVar304._12_4_ = auVar269._12_4_ * auVar87._12_4_;
              if (fVar192 < 0.0) {
                local_9a0._0_16_ = auVar240;
                local_a20._0_16_ = auVar304;
                local_b20._0_16_ = auVar184;
                fVar192 = sqrtf(fVar192);
                auVar184 = local_b20._0_16_;
                auVar240 = local_9a0._0_16_;
                auVar304 = local_a20._0_16_;
              }
              else {
                auVar95 = vsqrtss_avx(auVar95,auVar95);
                fVar192 = auVar95._0_4_;
              }
              auVar95 = vdpps_avx(_local_ae0,auVar304,0x7f);
              fVar231 = ((float)local_ac0._0_4_ / fVar192) * (fVar231 + 1.0) +
                        auVar303._0_4_ + fVar231 * (float)local_ac0._0_4_;
              auVar163 = vdpps_avx(auVar240,auVar304,0x7f);
              auVar87 = vdpps_avx(_local_ae0,auVar184,0x7f);
              auVar88 = vdpps_avx(_local_9b0,auVar304,0x7f);
              auVar119 = vdpps_avx(_local_ae0,auVar240,0x7f);
              fVar192 = auVar163._0_4_ + auVar87._0_4_;
              fVar222 = auVar95._0_4_;
              auVar96._0_4_ = fVar222 * fVar222;
              auVar96._4_4_ = auVar95._4_4_ * auVar95._4_4_;
              auVar96._8_4_ = auVar95._8_4_ * auVar95._8_4_;
              auVar96._12_4_ = auVar95._12_4_ * auVar95._12_4_;
              auVar87 = vsubps_avx(auVar129,auVar96);
              auVar163 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
              fVar250 = auVar119._0_4_ - fVar222 * fVar192;
              fVar224 = auVar163._0_4_ - fVar222 * auVar88._0_4_;
              auVar163 = vrsqrtss_avx(auVar87,auVar87);
              fVar253 = auVar87._0_4_;
              fVar222 = auVar163._0_4_;
              fVar222 = fVar222 * 1.5 + fVar253 * -0.5 * fVar222 * fVar222 * fVar222;
              if (fVar253 < 0.0) {
                local_9a0._0_16_ = auVar95;
                local_a20._0_4_ = fVar231;
                local_b20._0_16_ = auVar88;
                local_780._0_4_ = fVar250;
                local_7a0._0_4_ = fVar224;
                local_7c0._0_4_ = fVar222;
                fVar253 = sqrtf(fVar253);
                fVar222 = (float)local_7c0._0_4_;
                fVar250 = (float)local_780._0_4_;
                fVar224 = (float)local_7a0._0_4_;
                auVar88 = local_b20._0_16_;
                auVar95 = local_9a0._0_16_;
                fVar231 = (float)local_a20._0_4_;
              }
              else {
                auVar163 = vsqrtss_avx(auVar87,auVar87);
                fVar253 = auVar163._0_4_;
              }
              auVar86 = vpermilps_avx(local_940._0_16_,0xff);
              auVar119 = vshufps_avx(auVar269,auVar269,0xff);
              fVar196 = fVar250 * fVar222 - auVar119._0_4_;
              auVar214._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar214._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar214._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar241._0_4_ = -fVar196;
              auVar241._4_4_ = 0x80000000;
              auVar241._8_4_ = 0x80000000;
              auVar241._12_4_ = 0x80000000;
              fVar250 = fVar192 * fVar224 * fVar222;
              auVar276 = ZEXT464((uint)fVar250);
              auVar163 = vinsertps_avx(ZEXT416((uint)(fVar224 * fVar222)),auVar214,0x10);
              auVar87 = vmovsldup_avx(ZEXT416((uint)(fVar250 - auVar88._0_4_ * fVar196)));
              auVar163 = vdivps_avx(auVar163,auVar87);
              auVar86 = ZEXT416((uint)(fVar253 - auVar86._0_4_));
              auVar88 = vinsertps_avx(auVar95,auVar86,0x10);
              auVar185._0_4_ = auVar88._0_4_ * auVar163._0_4_;
              auVar185._4_4_ = auVar88._4_4_ * auVar163._4_4_;
              auVar185._8_4_ = auVar88._8_4_ * auVar163._8_4_;
              auVar185._12_4_ = auVar88._12_4_ * auVar163._12_4_;
              auVar163 = vinsertps_avx(auVar241,ZEXT416((uint)fVar192),0x1c);
              auVar163 = vdivps_avx(auVar163,auVar87);
              auVar87 = vhaddps_avx(auVar185,auVar185);
              auVar164._0_4_ = auVar88._0_4_ * auVar163._0_4_;
              auVar164._4_4_ = auVar88._4_4_ * auVar163._4_4_;
              auVar164._8_4_ = auVar88._8_4_ * auVar163._8_4_;
              auVar164._12_4_ = auVar88._12_4_ * auVar163._12_4_;
              auVar163 = vhaddps_avx(auVar164,auVar164);
              fVar194 = fVar194 - auVar87._0_4_;
              auVar191 = ZEXT464((uint)fVar194);
              fVar192 = auVar334._0_4_ - auVar163._0_4_;
              auVar334 = ZEXT464((uint)fVar192);
              auVar215._8_4_ = 0x7fffffff;
              auVar215._0_8_ = 0x7fffffff7fffffff;
              auVar215._12_4_ = 0x7fffffff;
              auVar221 = ZEXT1664(auVar215);
              auVar95 = vandps_avx(auVar95,auVar215);
              bVar45 = true;
              if (auVar95._0_4_ < fVar231) {
                auVar95 = vandps_avx(auVar86,auVar215);
                if (auVar95._0_4_ <
                    (float)local_7e0._0_4_ * 1.9073486e-06 + auVar303._0_4_ + fVar231) {
                  fVar192 = fVar192 + (float)local_920._0_4_;
                  auVar334 = ZEXT464((uint)fVar192);
                  if ((((fVar177 <= fVar192) &&
                       (fVar231 = *(float *)(ray + k * 4 + 0x100), fVar192 <= fVar231)) &&
                      (0.0 <= fVar194)) && (fVar194 <= 1.0)) {
                    auVar129 = vrsqrtss_avx(auVar129,auVar129);
                    fVar222 = auVar129._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar80].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_BL = true;
                      }
                      else {
                        auVar129 = ZEXT416((uint)(fVar222 * 1.5 +
                                                 fVar202 * -0.5 * fVar222 * fVar222 * fVar222));
                        auVar129 = vshufps_avx(auVar129,auVar129,0);
                        auVar130._0_4_ = auVar129._0_4_ * (float)local_ae0._0_4_;
                        auVar130._4_4_ = auVar129._4_4_ * (float)local_ae0._4_4_;
                        auVar130._8_4_ = auVar129._8_4_ * fStack_ad8;
                        auVar130._12_4_ = auVar129._12_4_ * fStack_ad4;
                        auVar97._0_4_ = auVar269._0_4_ + auVar119._0_4_ * auVar130._0_4_;
                        auVar97._4_4_ = auVar269._4_4_ + auVar119._4_4_ * auVar130._4_4_;
                        auVar97._8_4_ = auVar269._8_4_ + auVar119._8_4_ * auVar130._8_4_;
                        auVar97._12_4_ = auVar269._12_4_ + auVar119._12_4_ * auVar130._12_4_;
                        auVar129 = vshufps_avx(auVar130,auVar130,0xc9);
                        auVar303 = vshufps_avx(auVar269,auVar269,0xc9);
                        auVar131._0_4_ = auVar303._0_4_ * auVar130._0_4_;
                        auVar131._4_4_ = auVar303._4_4_ * auVar130._4_4_;
                        auVar131._8_4_ = auVar303._8_4_ * auVar130._8_4_;
                        auVar131._12_4_ = auVar303._12_4_ * auVar130._12_4_;
                        auVar165._0_4_ = auVar269._0_4_ * auVar129._0_4_;
                        auVar165._4_4_ = auVar269._4_4_ * auVar129._4_4_;
                        auVar165._8_4_ = auVar269._8_4_ * auVar129._8_4_;
                        auVar165._12_4_ = auVar269._12_4_ * auVar129._12_4_;
                        auVar95 = vsubps_avx(auVar165,auVar131);
                        auVar129 = vshufps_avx(auVar95,auVar95,0xc9);
                        auVar303 = vshufps_avx(auVar97,auVar97,0xc9);
                        auVar166._0_4_ = auVar303._0_4_ * auVar129._0_4_;
                        auVar166._4_4_ = auVar303._4_4_ * auVar129._4_4_;
                        auVar166._8_4_ = auVar303._8_4_ * auVar129._8_4_;
                        auVar166._12_4_ = auVar303._12_4_ * auVar129._12_4_;
                        auVar129 = vshufps_avx(auVar95,auVar95,0xd2);
                        auVar98._0_4_ = auVar97._0_4_ * auVar129._0_4_;
                        auVar98._4_4_ = auVar97._4_4_ * auVar129._4_4_;
                        auVar98._8_4_ = auVar97._8_4_ * auVar129._8_4_;
                        auVar98._12_4_ = auVar97._12_4_ * auVar129._12_4_;
                        auVar129 = vsubps_avx(auVar166,auVar98);
                        pRVar5 = context->user;
                        auVar303 = ZEXT416((uint)fVar194);
                        local_570 = vshufps_avx(auVar303,auVar303,0);
                        auStack_5d0 = vshufps_avx(auVar129,auVar129,0x55);
                        local_5b0 = vshufps_avx(auVar129,auVar129,0xaa);
                        local_590 = vshufps_avx(auVar129,auVar129,0);
                        local_5e0 = (RTCHitN  [16])auStack_5d0;
                        local_5c0 = local_5b0;
                        local_5a0 = local_590;
                        local_580 = local_570;
                        local_560 = ZEXT832(0) << 0x20;
                        local_540 = local_4a0._0_8_;
                        uStack_538 = local_4a0._8_8_;
                        uStack_530 = local_4a0._16_8_;
                        uStack_528 = local_4a0._24_8_;
                        local_520 = local_480._0_8_;
                        uStack_518 = local_480._8_8_;
                        uStack_510 = local_480._16_8_;
                        uStack_508 = local_480._24_8_;
                        local_a78[1] = local_a40;
                        *local_a78 = local_a40;
                        local_500 = pRVar5->instID[0];
                        uStack_4fc = local_500;
                        uStack_4f8 = local_500;
                        uStack_4f4 = local_500;
                        uStack_4f0 = local_500;
                        uStack_4ec = local_500;
                        uStack_4e8 = local_500;
                        uStack_4e4 = local_500;
                        local_4e0 = pRVar5->instPrimID[0];
                        uStack_4dc = local_4e0;
                        uStack_4d8 = local_4e0;
                        uStack_4d4 = local_4e0;
                        uStack_4d0 = local_4e0;
                        uStack_4cc = local_4e0;
                        uStack_4c8 = local_4e0;
                        uStack_4c4 = local_4e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar192;
                        local_b80 = *local_a80;
                        uStack_b78 = local_a80[1];
                        local_b70 = *local_a88;
                        uStack_b68 = local_a88[1];
                        local_a70.valid = (int *)&local_b80;
                        local_a70.geometryUserPtr = pGVar4->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_5e0;
                        local_a70.N = 8;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar276 = ZEXT464((uint)fVar250);
                          (*pGVar4->occlusionFilterN)(&local_a70);
                          auVar191 = ZEXT1664(auVar303);
                          auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar69._8_8_ = uStack_b78;
                        auVar69._0_8_ = local_b80;
                        auVar129 = vpcmpeqd_avx((undefined1  [16])0x0,auVar69);
                        auVar73._8_8_ = uStack_b68;
                        auVar73._0_8_ = local_b70;
                        auVar303 = vpcmpeqd_avx((undefined1  [16])0x0,auVar73);
                        auVar110._16_16_ = auVar303;
                        auVar110._0_16_ = auVar129;
                        auVar105 = local_a40 & ~auVar110;
                        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar105 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar105 >> 0x7f,0) == '\0')
                              && (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar105 >> 0xbf,0) == '\0') &&
                            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar105[0x1f]) {
                          auVar111._0_4_ = auVar129._0_4_ ^ local_a40._0_4_;
                          auVar111._4_4_ = auVar129._4_4_ ^ local_a40._4_4_;
                          auVar111._8_4_ = auVar129._8_4_ ^ local_a40._8_4_;
                          auVar111._12_4_ = auVar129._12_4_ ^ local_a40._12_4_;
                          auVar111._16_4_ = auVar303._0_4_ ^ local_a40._16_4_;
                          auVar111._20_4_ = auVar303._4_4_ ^ local_a40._20_4_;
                          auVar111._24_4_ = auVar303._8_4_ ^ local_a40._24_4_;
                          auVar111._28_4_ = auVar303._12_4_ ^ local_a40._28_4_;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var6)(&local_a70);
                            auVar191 = ZEXT1664(auVar191._0_16_);
                            auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar70._8_8_ = uStack_b78;
                          auVar70._0_8_ = local_b80;
                          auVar129 = vpcmpeqd_avx((undefined1  [16])0x0,auVar70);
                          auVar74._8_8_ = uStack_b68;
                          auVar74._0_8_ = local_b70;
                          auVar303 = vpcmpeqd_avx((undefined1  [16])0x0,auVar74);
                          auVar150._16_16_ = auVar303;
                          auVar150._0_16_ = auVar129;
                          auVar111._0_4_ = auVar129._0_4_ ^ local_a40._0_4_;
                          auVar111._4_4_ = auVar129._4_4_ ^ local_a40._4_4_;
                          auVar111._8_4_ = auVar129._8_4_ ^ local_a40._8_4_;
                          auVar111._12_4_ = auVar129._12_4_ ^ local_a40._12_4_;
                          auVar111._16_4_ = auVar303._0_4_ ^ local_a40._16_4_;
                          auVar111._20_4_ = auVar303._4_4_ ^ local_a40._20_4_;
                          auVar111._24_4_ = auVar303._8_4_ ^ local_a40._24_4_;
                          auVar111._28_4_ = auVar303._12_4_ ^ local_a40._28_4_;
                          auVar173._8_4_ = 0xff800000;
                          auVar173._0_8_ = 0xff800000ff800000;
                          auVar173._12_4_ = 0xff800000;
                          auVar173._16_4_ = 0xff800000;
                          auVar173._20_4_ = 0xff800000;
                          auVar173._24_4_ = 0xff800000;
                          auVar173._28_4_ = 0xff800000;
                          auVar105 = vblendvps_avx(auVar173,*(undefined1 (*) [32])
                                                             (local_a70.ray + 0x100),auVar150);
                          *(undefined1 (*) [32])(local_a70.ray + 0x100) = auVar105;
                        }
                        bVar65 = (auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar66 = (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar64 = (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar63 = SUB321(auVar111 >> 0x7f,0) != '\0';
                        bVar62 = (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar61 = SUB321(auVar111 >> 0xbf,0) != '\0';
                        bVar60 = (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar45 = auVar111[0x1f] < '\0';
                        unaff_BL = ((((((bVar65 || bVar66) || bVar64) || bVar63) || bVar62) ||
                                    bVar61) || bVar60) || bVar45;
                        if (((((((!bVar65 && !bVar66) && !bVar64) && !bVar63) && !bVar62) && !bVar61
                             ) && !bVar60) && !bVar45) {
                          *(float *)(ray + k * 4 + 0x100) = fVar231;
                        }
                      }
                      auVar334 = ZEXT464((uint)fVar192);
                      bVar45 = false;
                      goto LAB_00eccdb9;
                    }
                  }
                  bVar45 = false;
                  unaff_BL = 0;
                }
              }
LAB_00eccdb9:
              if (!bVar45) goto LAB_00ecd11f;
              lVar83 = lVar83 + -1;
            } while (lVar83 != 0);
            unaff_BL = 0;
LAB_00ecd11f:
            unaff_BL = unaff_BL & 1;
            uVar85 = CONCAT71(local_800._1_7_,local_800[0] | unaff_BL);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar112._4_4_ = uVar1;
            auVar112._0_4_ = uVar1;
            auVar112._8_4_ = uVar1;
            auVar112._12_4_ = uVar1;
            auVar112._16_4_ = uVar1;
            auVar112._20_4_ = uVar1;
            auVar112._24_4_ = uVar1;
            auVar112._28_4_ = uVar1;
            auVar100 = vcmpps_avx(_local_860,auVar112,2);
            auVar105 = vandps_avx(auVar100,local_720);
            local_720 = local_720 & auVar100;
            uVar81 = local_740;
          } while ((((((((local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_720 >> 0x7f,0) != '\0') ||
                     (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_720 >> 0xbf,0) != '\0') ||
                   (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_720[0x1f] < '\0');
        }
        auVar105 = vandps_avx(local_680,local_660);
        auVar100 = vandps_avx(_local_8e0,_local_8c0);
        auVar174._0_4_ = local_9e0 + local_420._0_4_;
        auVar174._4_4_ = fStack_9dc + local_420._4_4_;
        auVar174._8_4_ = fStack_9d8 + local_420._8_4_;
        auVar174._12_4_ = fStack_9d4 + local_420._12_4_;
        auVar174._16_4_ = fStack_9d0 + local_420._16_4_;
        auVar174._20_4_ = fStack_9cc + local_420._20_4_;
        auVar174._24_4_ = fStack_9c8 + local_420._24_4_;
        auVar174._28_4_ = fStack_9c4 + local_420._28_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar220._4_4_ = uVar1;
        auVar220._0_4_ = uVar1;
        auVar220._8_4_ = uVar1;
        auVar220._12_4_ = uVar1;
        auVar220._16_4_ = uVar1;
        auVar220._20_4_ = uVar1;
        auVar220._24_4_ = uVar1;
        auVar220._28_4_ = uVar1;
        auVar10 = vcmpps_avx(auVar174,auVar220,2);
        auVar105 = vandps_avx(auVar10,auVar105);
        auVar248._0_4_ = local_9e0 + local_3e0._0_4_;
        auVar248._4_4_ = fStack_9dc + local_3e0._4_4_;
        auVar248._8_4_ = fStack_9d8 + local_3e0._8_4_;
        auVar248._12_4_ = fStack_9d4 + local_3e0._12_4_;
        auVar248._16_4_ = fStack_9d0 + local_3e0._16_4_;
        auVar248._20_4_ = fStack_9cc + local_3e0._20_4_;
        auVar248._24_4_ = fStack_9c8 + local_3e0._24_4_;
        auVar248._28_4_ = fStack_9c4 + local_3e0._28_4_;
        auVar10 = vcmpps_avx(auVar248,auVar220,2);
        auVar100 = vandps_avx(auVar10,auVar100);
        auVar100 = vorps_avx(auVar105,auVar100);
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar100;
          auVar105 = vblendvps_avx(_local_3e0,_local_420,auVar105);
          *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar105;
          uVar2 = vmovlps_avx(local_910);
          *(undefined8 *)(afStack_140 + uVar78 * 0x18) = uVar2;
          auStack_138[uVar78 * 0x18] = (int)uVar81 + 1;
          uVar78 = (ulong)((int)uVar78 + 1);
        }
        auVar218._8_4_ = 0x7f800000;
        auVar218._0_8_ = 0x7f8000007f800000;
        auVar218._12_4_ = 0x7f800000;
        auVar218._16_4_ = 0x7f800000;
        auVar218._20_4_ = 0x7f800000;
        auVar218._24_4_ = 0x7f800000;
        auVar218._28_4_ = 0x7f800000;
      }
    }
    auVar221 = ZEXT3264(auVar218);
    auVar191 = ZEXT3264(CONCAT428(fStack_9c4,
                                  CONCAT424(fStack_9c8,
                                            CONCAT420(fStack_9cc,
                                                      CONCAT416(fStack_9d0,
                                                                CONCAT412(fStack_9d4,
                                                                          CONCAT48(fStack_9d8,
                                                                                   CONCAT44(
                                                  fStack_9dc,local_9e0))))))));
    do {
      uVar82 = (uint)uVar78;
      if (uVar82 == 0) {
        if ((uVar85 & 1) != 0) {
          return local_c69;
        }
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar99._4_4_ = uVar1;
        auVar99._0_4_ = uVar1;
        auVar99._8_4_ = uVar1;
        auVar99._12_4_ = uVar1;
        auVar120 = vcmpps_avx(local_5f0,auVar99,2);
        uVar80 = vmovmskps_avx(auVar120);
        uVar80 = (uint)local_8e8 & uVar80;
        local_c69 = uVar80 != 0;
        if (!local_c69) {
          return local_c69;
        }
        goto LAB_00eca8c8;
      }
      uVar78 = (ulong)(uVar82 - 1);
      lVar83 = uVar78 * 0x60;
      auVar105 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar103._0_4_ = auVar191._0_4_ + auVar105._0_4_;
      auVar103._4_4_ = auVar191._4_4_ + auVar105._4_4_;
      auVar103._8_4_ = auVar191._8_4_ + auVar105._8_4_;
      auVar103._12_4_ = auVar191._12_4_ + auVar105._12_4_;
      auVar103._16_4_ = auVar191._16_4_ + auVar105._16_4_;
      auVar103._20_4_ = auVar191._20_4_ + auVar105._20_4_;
      auVar103._24_4_ = auVar191._24_4_ + auVar105._24_4_;
      auVar103._28_4_ = auVar191._28_4_ + auVar105._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar189._4_4_ = uVar1;
      auVar189._0_4_ = uVar1;
      auVar189._8_4_ = uVar1;
      auVar189._12_4_ = uVar1;
      auVar189._16_4_ = uVar1;
      auVar189._20_4_ = uVar1;
      auVar189._24_4_ = uVar1;
      auVar189._28_4_ = uVar1;
      auVar10 = vcmpps_avx(auVar103,auVar189,2);
      auVar100 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar83));
      _local_5e0 = auVar100;
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar83) & auVar10;
      bVar65 = (auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar66 = (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar64 = (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar63 = SUB321(auVar10 >> 0x7f,0) == '\0';
      bVar62 = (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar61 = SUB321(auVar10 >> 0xbf,0) == '\0';
      bVar60 = (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar45 = -1 < auVar10[0x1f];
      if (((((((!bVar65 || !bVar66) || !bVar64) || !bVar63) || !bVar62) || !bVar61) || !bVar60) ||
          !bVar45) {
        auVar105 = vblendvps_avx(auVar218,auVar105,auVar100);
        auVar10 = vshufps_avx(auVar105,auVar105,0xb1);
        auVar10 = vminps_avx(auVar105,auVar10);
        auVar11 = vshufpd_avx(auVar10,auVar10,5);
        auVar10 = vminps_avx(auVar10,auVar11);
        auVar11 = vperm2f128_avx(auVar10,auVar10,1);
        auVar10 = vminps_avx(auVar10,auVar11);
        auVar105 = vcmpps_avx(auVar105,auVar10,0);
        auVar10 = auVar100 & auVar105;
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0x7f,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0xbf,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          auVar100 = vandps_avx(auVar105,auVar100);
        }
        fVar202 = afStack_140[uVar78 * 0x18 + 1];
        uVar81 = (ulong)auStack_138[uVar78 * 0x18];
        uVar84 = vmovmskps_avx(auVar100);
        uVar77 = 0;
        if (uVar84 != 0) {
          for (; (uVar84 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
          }
        }
        fVar231 = afStack_140[uVar78 * 0x18];
        *(undefined4 *)(local_5e0 + (ulong)uVar77 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar83) = _local_5e0;
        uVar84 = uVar82 - 1;
        if ((((((((_local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_5e0 >> 0x7f,0) != '\0') ||
              (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_5e0 >> 0xbf,0) != '\0') ||
            (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_5e0[0x1f] < '\0') {
          uVar84 = uVar82;
        }
        auVar129 = vshufps_avx(ZEXT416((uint)(fVar202 - fVar231)),ZEXT416((uint)(fVar202 - fVar231))
                               ,0);
        local_420._4_4_ = fVar231 + auVar129._4_4_ * 0.14285715;
        local_420._0_4_ = fVar231 + auVar129._0_4_ * 0.0;
        fStack_418 = fVar231 + auVar129._8_4_ * 0.2857143;
        fStack_414 = fVar231 + auVar129._12_4_ * 0.42857146;
        fStack_410 = fVar231 + auVar129._0_4_ * 0.5714286;
        fStack_40c = fVar231 + auVar129._4_4_ * 0.71428573;
        fStack_408 = fVar231 + auVar129._8_4_ * 0.8571429;
        fStack_404 = fVar231 + auVar129._12_4_;
        local_910._8_8_ = 0;
        local_910._0_8_ = *(ulong *)(local_420 + (ulong)uVar77 * 4);
        uVar78 = (ulong)uVar84;
      }
      auVar191 = ZEXT3264(CONCAT428(fStack_9c4,
                                    CONCAT424(fStack_9c8,
                                              CONCAT420(fStack_9cc,
                                                        CONCAT416(fStack_9d0,
                                                                  CONCAT412(fStack_9d4,
                                                                            CONCAT48(fStack_9d8,
                                                                                     CONCAT44(
                                                  fStack_9dc,local_9e0))))))));
    } while (((((((bVar65 && bVar66) && bVar64) && bVar63) && bVar62) && bVar61) && bVar60) &&
             bVar45);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }